

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::sse2::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse2::SubGridIntersectorKMoeller<4,_4,_true>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float fVar4;
  float fVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  int iVar9;
  ulong uVar10;
  Geometry *pGVar11;
  size_t sVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  byte bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  undefined1 auVar24 [13];
  undefined1 auVar25 [13];
  undefined1 auVar26 [13];
  undefined1 auVar27 [13];
  undefined1 auVar28 [13];
  undefined1 auVar29 [13];
  undefined1 auVar30 [13];
  undefined1 auVar31 [13];
  undefined1 auVar32 [13];
  undefined1 auVar33 [13];
  undefined1 auVar34 [13];
  undefined1 auVar35 [13];
  undefined1 auVar36 [13];
  undefined1 auVar37 [13];
  undefined1 auVar38 [13];
  undefined1 auVar39 [13];
  undefined1 auVar40 [13];
  undefined1 auVar41 [13];
  undefined1 auVar42 [13];
  undefined1 auVar43 [14];
  undefined1 auVar44 [12];
  unkbyte10 Var45;
  undefined1 auVar46 [12];
  undefined1 auVar47 [14];
  undefined1 auVar48 [14];
  undefined1 auVar49 [16];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar50;
  int iVar51;
  undefined4 uVar52;
  undefined4 uVar53;
  long lVar54;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar55;
  long lVar56;
  Scene *pSVar57;
  RTCFilterFunctionN p_Var58;
  RTCRayN *pRVar59;
  int iVar60;
  ulong uVar61;
  uint uVar62;
  ulong uVar63;
  long lVar64;
  uint uVar65;
  ulong uVar66;
  long lVar67;
  ulong uVar68;
  long lVar69;
  ulong uVar70;
  long lVar71;
  ulong uVar72;
  ulong uVar73;
  ulong uVar74;
  uint uVar75;
  uint uVar76;
  uint uVar77;
  uint uVar78;
  byte bVar79;
  char cVar80;
  byte bVar103;
  byte bVar105;
  char cVar107;
  char cVar108;
  char cVar109;
  char cVar110;
  byte bVar112;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  char cVar104;
  char cVar106;
  undefined1 auVar88 [16];
  undefined1 auVar95 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar100;
  undefined1 auVar101 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar102;
  float fVar113;
  float fVar137;
  float fVar138;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar139;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  float fVar140;
  float fVar155;
  float fVar156;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar157;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar158;
  float fVar174;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  float fVar175;
  uint uVar176;
  float fVar182;
  float fVar184;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  uint uVar183;
  uint uVar185;
  float fVar186;
  uint uVar187;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  float fVar188;
  float fVar189;
  float fVar195;
  float fVar196;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  float fVar197;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  float fVar198;
  float fVar204;
  float fVar205;
  undefined1 auVar199 [16];
  float fVar206;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  float fVar207;
  float fVar212;
  float fVar213;
  float fVar214;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  int iVar223;
  int iVar224;
  int iVar225;
  float fVar226;
  float fVar227;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  undefined1 auVar228 [16];
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  float fVar242;
  float fVar243;
  float fVar244;
  vint<4> sy;
  float fVar245;
  float fVar246;
  float fVar247;
  float fVar248;
  int iVar249;
  float fVar250;
  float fVar251;
  int iVar252;
  float fVar253;
  float fVar254;
  int iVar255;
  float fVar256;
  float fVar257;
  int iVar258;
  float fVar259;
  float fVar260;
  float fVar261;
  vint<4> sx;
  float fVar262;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  float fStack_1390;
  float fStack_138c;
  undefined8 local_1378;
  float fStack_1370;
  float fStack_136c;
  float fStack_135c;
  undefined8 local_1358;
  float fStack_1350;
  float fStack_134c;
  vbool<4> valid;
  undefined1 local_1338 [16];
  float local_1328;
  float fStack_1324;
  float fStack_1320;
  float fStack_131c;
  float local_1318;
  float fStack_1314;
  float fStack_1310;
  float fStack_130c;
  float local_1308;
  float fStack_1304;
  float fStack_1300;
  float fStack_12fc;
  float local_12f8;
  float fStack_12f4;
  float fStack_12f0;
  float fStack_12ec;
  RTCFilterFunctionNArguments args;
  float fStack_12ac;
  undefined1 local_12a8 [8];
  float fStack_12a0;
  float fStack_129c;
  float fStack_124c;
  float fStack_123c;
  float fStack_1230;
  float fStack_122c;
  vfloat<4> tNear;
  float local_11c8 [4];
  float local_11b8 [4];
  float local_11a8 [4];
  float local_1198 [4];
  undefined8 local_1188;
  undefined8 uStack_1180;
  undefined1 local_1178 [16];
  float local_1168;
  float fStack_1164;
  float fStack_1160;
  float fStack_115c;
  undefined1 local_1158 [16];
  undefined8 local_1148;
  float fStack_1140;
  float fStack_113c;
  int local_1138;
  int iStack_1134;
  int iStack_1130;
  int iStack_112c;
  ulong local_1128;
  ulong local_1120;
  ulong local_1118;
  ulong local_1110;
  ulong local_1108;
  ulong local_1100;
  ulong local_10f8;
  ulong local_10f0;
  ulong local_10e8;
  long local_10e0;
  long local_10d8;
  ulong local_10d0;
  size_t local_10c8;
  ulong local_10c0;
  undefined1 local_10b8 [16];
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  undefined1 local_1078 [16];
  undefined1 local_1068 [16];
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  undefined1 local_1048 [8];
  float fStack_1040;
  float fStack_103c;
  undefined8 local_1038;
  undefined8 uStack_1030;
  undefined8 local_1028;
  undefined8 uStack_1020;
  uint local_1018;
  uint uStack_1014;
  uint uStack_1010;
  uint uStack_100c;
  uint local_1008;
  uint uStack_1004;
  uint uStack_1000;
  uint uStack_ffc;
  undefined1 local_ff8 [16];
  uint local_fe8;
  uint uStack_fe4;
  uint uStack_fe0;
  uint uStack_fdc;
  int local_fd8;
  int iStack_fd4;
  int iStack_fd0;
  int iStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  int local_fa8;
  int iStack_fa4;
  int iStack_fa0;
  int iStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  vfloat<4> dist;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 auVar89 [16];
  undefined1 auVar81 [11];
  undefined1 auVar90 [16];
  undefined1 auVar96 [16];
  undefined1 auVar82 [12];
  undefined1 auVar91 [16];
  undefined1 auVar83 [13];
  undefined1 auVar92 [16];
  undefined1 auVar97 [16];
  undefined1 auVar94 [16];
  undefined1 auVar93 [16];
  undefined2 uVar111;
  
  pSVar55 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  fVar248 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar4 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar198 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar5 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar207 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar215 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar70 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar72 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar74 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar63 = uVar70 ^ 0x10;
  uVar66 = uVar72 ^ 0x10;
  uVar68 = uVar74 ^ 0x10;
  iVar60 = (tray->tnear).field_0.i[k];
  iVar258 = (tray->tfar).field_0.i[k];
  local_10e8 = uVar70 >> 2;
  local_10f0 = uVar63 >> 2;
  local_10f8 = uVar72 >> 2;
  local_1100 = uVar66 >> 2;
  local_1108 = uVar74 >> 2;
  local_1110 = uVar68 >> 2;
  lVar54 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
  local_1168 = fVar248;
  fStack_1164 = fVar248;
  fStack_1160 = fVar248;
  fStack_115c = fVar248;
  local_1098 = fVar198;
  fStack_1094 = fVar198;
  fStack_1090 = fVar198;
  fStack_108c = fVar198;
  local_10a8 = fVar207;
  fStack_10a4 = fVar207;
  fStack_10a0 = fVar207;
  fStack_109c = fVar207;
  local_fc8 = fVar215;
  fStack_fc4 = fVar215;
  fStack_fc0 = fVar215;
  fStack_fbc = fVar215;
  local_1118 = uVar70;
  local_1120 = uVar72;
  local_1128 = uVar74;
  local_10d0 = uVar63;
  local_fd8 = iVar60;
  iStack_fd4 = iVar60;
  iStack_fd0 = iVar60;
  iStack_fcc = iVar60;
  fVar227 = fVar248;
  fVar217 = fVar248;
  fVar189 = fVar248;
  fVar186 = fVar215;
  fVar184 = fVar215;
  fVar182 = fVar215;
  iVar255 = iVar258;
  iVar252 = iVar258;
  iVar249 = iVar258;
  fVar175 = fVar198;
  fVar139 = fVar198;
  fVar138 = fVar198;
  fVar137 = fVar207;
  fVar113 = fVar207;
  fVar230 = fVar207;
  iVar225 = iVar60;
  iVar224 = iVar60;
  iVar223 = iVar60;
LAB_0020b617:
  do {
    pSVar50 = pSVar55 + -1;
    pSVar55 = pSVar55 + -1;
    if ((float)pSVar50->dist < *(float *)(ray + k * 4 + 0x80) ||
        (float)pSVar50->dist == *(float *)(ray + k * 4 + 0x80)) {
      uVar73 = (pSVar55->ptr).ptr;
      while ((uVar73 & 8) == 0) {
        pfVar3 = (float *)(uVar73 + 0x20 + uVar70);
        auVar142._0_4_ = (*pfVar3 - fVar248) * fVar5;
        auVar142._4_4_ = (pfVar3[1] - fVar227) * fVar5;
        auVar142._8_4_ = (pfVar3[2] - fVar217) * fVar5;
        auVar142._12_4_ = (pfVar3[3] - fVar189) * fVar5;
        pfVar3 = (float *)(uVar73 + 0x20 + uVar72);
        auVar191._0_4_ = (*pfVar3 - fVar4) * fVar230;
        auVar191._4_4_ = (pfVar3[1] - fVar4) * fVar113;
        auVar191._8_4_ = (pfVar3[2] - fVar4) * fVar137;
        auVar191._12_4_ = (pfVar3[3] - fVar4) * fVar207;
        auVar84 = maxps(auVar142,auVar191);
        pfVar3 = (float *)(uVar73 + 0x20 + uVar74);
        auVar114._0_4_ = (*pfVar3 - fVar138) * fVar182;
        auVar114._4_4_ = (pfVar3[1] - fVar139) * fVar184;
        auVar114._8_4_ = (pfVar3[2] - fVar175) * fVar186;
        auVar114._12_4_ = (pfVar3[3] - fVar198) * fVar215;
        pfVar3 = (float *)(uVar73 + 0x20 + uVar63);
        auVar141._0_4_ = (*pfVar3 - fVar248) * fVar5;
        auVar141._4_4_ = (pfVar3[1] - fVar227) * fVar5;
        auVar141._8_4_ = (pfVar3[2] - fVar217) * fVar5;
        auVar141._12_4_ = (pfVar3[3] - fVar189) * fVar5;
        pfVar3 = (float *)(uVar73 + 0x20 + uVar66);
        auVar159._0_4_ = (*pfVar3 - fVar4) * fVar230;
        auVar159._4_4_ = (pfVar3[1] - fVar4) * fVar113;
        auVar159._8_4_ = (pfVar3[2] - fVar4) * fVar137;
        auVar159._12_4_ = (pfVar3[3] - fVar4) * fVar207;
        auVar142 = minps(auVar141,auVar159);
        pfVar3 = (float *)(uVar73 + 0x20 + uVar68);
        auVar160._0_4_ = (*pfVar3 - fVar138) * fVar182;
        auVar160._4_4_ = (pfVar3[1] - fVar139) * fVar184;
        auVar160._8_4_ = (pfVar3[2] - fVar175) * fVar186;
        auVar160._12_4_ = (pfVar3[3] - fVar198) * fVar215;
        auVar115._4_4_ = iVar224;
        auVar115._0_4_ = iVar223;
        auVar115._8_4_ = iVar225;
        auVar115._12_4_ = iVar60;
        auVar115 = maxps(auVar114,auVar115);
        tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar84,auVar115);
        auVar84._4_4_ = iVar252;
        auVar84._0_4_ = iVar249;
        auVar84._8_4_ = iVar255;
        auVar84._12_4_ = iVar258;
        auVar115 = minps(auVar160,auVar84);
        auVar115 = minps(auVar142,auVar115);
        auVar178._4_4_ = -(uint)(tNear.field_0._4_4_ <= auVar115._4_4_);
        auVar178._0_4_ = -(uint)(tNear.field_0._0_4_ <= auVar115._0_4_);
        auVar178._8_4_ = -(uint)(tNear.field_0._8_4_ <= auVar115._8_4_);
        auVar178._12_4_ = -(uint)(tNear.field_0._12_4_ <= auVar115._12_4_);
        uVar62 = movmskps((int)root.ptr,auVar178);
        root.ptr = (size_t)uVar62;
        if (uVar62 == 0) {
          if (pSVar55 == stack) {
            return;
          }
          goto LAB_0020b617;
        }
        uVar61 = uVar73 & 0xfffffffffffffff0;
        root.ptr = 0;
        if ((byte)uVar62 != 0) {
          for (; ((byte)uVar62 >> root.ptr & 1) == 0; root.ptr = root.ptr + 1) {
          }
        }
        uVar73 = *(ulong *)(uVar61 + root.ptr * 8);
        uVar62 = (uVar62 & 0xff) - 1 & uVar62 & 0xff;
        if (uVar62 != 0) {
          uVar65 = tNear.field_0.i[root.ptr];
          lVar56 = 0;
          if (uVar62 != 0) {
            for (; (uVar62 >> lVar56 & 1) == 0; lVar56 = lVar56 + 1) {
            }
          }
          uVar10 = *(ulong *)(uVar61 + lVar56 * 8);
          uVar176 = tNear.field_0.i[lVar56];
          uVar62 = uVar62 - 1 & uVar62;
          root.ptr = (size_t)uVar62;
          if (uVar62 == 0) {
            if (uVar65 < uVar176) {
              (pSVar55->ptr).ptr = uVar10;
              pSVar55->dist = uVar176;
              pSVar55 = pSVar55 + 1;
            }
            else {
              (pSVar55->ptr).ptr = uVar73;
              pSVar55->dist = uVar65;
              pSVar55 = pSVar55 + 1;
              uVar73 = uVar10;
            }
          }
          else {
            auVar85._8_4_ = uVar65;
            auVar85._0_8_ = uVar73;
            auVar85._12_4_ = 0;
            auVar116._8_4_ = uVar176;
            auVar116._0_8_ = uVar10;
            auVar116._12_4_ = 0;
            lVar56 = 0;
            if (root.ptr != 0) {
              for (; (uVar62 >> lVar56 & 1) == 0; lVar56 = lVar56 + 1) {
              }
            }
            uVar73 = *(ulong *)(uVar61 + lVar56 * 8);
            iVar51 = tNear.field_0.i[lVar56];
            auVar143._8_4_ = iVar51;
            auVar143._0_8_ = uVar73;
            auVar143._12_4_ = 0;
            auVar161._8_4_ = -(uint)((int)uVar65 < (int)uVar176);
            uVar62 = uVar62 - 1 & uVar62;
            if (uVar62 == 0) {
              auVar161._4_4_ = auVar161._8_4_;
              auVar161._0_4_ = auVar161._8_4_;
              auVar161._12_4_ = auVar161._8_4_;
              auVar115 = auVar85 & auVar161 | ~auVar161 & auVar116;
              auVar84 = auVar116 & auVar161 | ~auVar161 & auVar85;
              auVar162._8_4_ = -(uint)(auVar115._8_4_ < iVar51);
              auVar162._0_8_ = CONCAT44(auVar162._8_4_,auVar162._8_4_);
              auVar162._12_4_ = auVar162._8_4_;
              uVar73 = ~auVar162._0_8_ & uVar73 | auVar115._0_8_ & auVar162._0_8_;
              auVar115 = auVar143 & auVar162 | ~auVar162 & auVar115;
              auVar86._8_4_ = -(uint)(auVar84._8_4_ < auVar115._8_4_);
              auVar86._4_4_ = auVar86._8_4_;
              auVar86._0_4_ = auVar86._8_4_;
              auVar86._12_4_ = auVar86._8_4_;
              *pSVar55 = (StackItemT<embree::NodeRefPtr<4>_>)
                         (~auVar86 & auVar84 | auVar115 & auVar86);
              pSVar55[1] = (StackItemT<embree::NodeRefPtr<4>_>)
                           (auVar84 & auVar86 | ~auVar86 & auVar115);
              pSVar55 = pSVar55 + 2;
            }
            else {
              root.ptr = 0;
              if (uVar62 != 0) {
                for (; (uVar62 >> root.ptr & 1) == 0; root.ptr = root.ptr + 1) {
                }
              }
              iVar9 = tNear.field_0.i[root.ptr];
              auVar177._8_4_ = iVar9;
              auVar177._0_8_ = *(undefined8 *)(uVar61 + root.ptr * 8);
              auVar177._12_4_ = 0;
              auVar163._4_4_ = auVar161._8_4_;
              auVar163._0_4_ = auVar161._8_4_;
              auVar163._8_4_ = auVar161._8_4_;
              auVar163._12_4_ = auVar161._8_4_;
              auVar115 = auVar85 & auVar163 | ~auVar163 & auVar116;
              auVar84 = auVar116 & auVar163 | ~auVar163 & auVar85;
              auVar190._0_4_ = -(uint)(iVar51 < iVar9);
              auVar190._4_4_ = -(uint)(iVar51 < iVar9);
              auVar190._8_4_ = -(uint)(iVar51 < iVar9);
              auVar190._12_4_ = -(uint)(iVar51 < iVar9);
              auVar142 = auVar143 & auVar190 | ~auVar190 & auVar177;
              auVar191 = ~auVar190 & auVar143 | auVar177 & auVar190;
              auVar144._8_4_ = -(uint)(auVar84._8_4_ < auVar191._8_4_);
              auVar144._4_4_ = auVar144._8_4_;
              auVar144._0_4_ = auVar144._8_4_;
              auVar144._12_4_ = auVar144._8_4_;
              auVar178 = auVar84 & auVar144 | ~auVar144 & auVar191;
              auVar117._8_4_ = -(uint)(auVar115._8_4_ < auVar142._8_4_);
              auVar117._0_8_ = CONCAT44(auVar117._8_4_,auVar117._8_4_);
              auVar117._12_4_ = auVar117._8_4_;
              uVar73 = auVar115._0_8_ & auVar117._0_8_ | ~auVar117._0_8_ & auVar142._0_8_;
              auVar115 = ~auVar117 & auVar115 | auVar142 & auVar117;
              auVar87._8_4_ = -(uint)(auVar115._8_4_ < auVar178._8_4_);
              auVar87._4_4_ = auVar87._8_4_;
              auVar87._0_4_ = auVar87._8_4_;
              auVar87._12_4_ = auVar87._8_4_;
              *pSVar55 = (StackItemT<embree::NodeRefPtr<4>_>)
                         (~auVar144 & auVar84 | auVar191 & auVar144);
              pSVar55[1] = (StackItemT<embree::NodeRefPtr<4>_>)
                           (~auVar87 & auVar115 | auVar178 & auVar87);
              pSVar55[2] = (StackItemT<embree::NodeRefPtr<4>_>)
                           (auVar115 & auVar87 | ~auVar87 & auVar178);
              pSVar55 = pSVar55 + 3;
              fVar248 = local_1168;
              fVar227 = fStack_1164;
              fVar217 = fStack_1160;
              fVar189 = fStack_115c;
            }
          }
        }
      }
      local_10e0 = (ulong)((uint)uVar73 & 0xf) - 8;
      if (local_10e0 != 0) {
        uVar73 = uVar73 & 0xfffffffffffffff0;
        local_10d8 = 0;
        local_fa8 = iVar249;
        iStack_fa4 = iVar252;
        iStack_fa0 = iVar255;
        iStack_f9c = iVar258;
        do {
          lVar56 = local_10d8 * 0x58;
          root.ptr = uVar73 + lVar56;
          uVar8 = *(undefined8 *)(uVar73 + 0x20 + lVar56);
          uVar52 = *(undefined4 *)(uVar73 + 0x24 + lVar56);
          bVar112 = (byte)uVar8;
          bVar79 = (byte)uVar52;
          bVar13 = (byte)((ulong)uVar8 >> 8);
          bVar103 = (byte)((uint)uVar52 >> 8);
          bVar14 = (byte)((ulong)uVar8 >> 0x10);
          bVar105 = (byte)((uint)uVar52 >> 0x10);
          bVar19 = (byte)((uint)uVar52 >> 0x18);
          bVar15 = (byte)((ulong)uVar8 >> 0x18);
          cVar80 = -((byte)((bVar112 < bVar79) * bVar112 | (bVar112 >= bVar79) * bVar79) == bVar112)
          ;
          cVar104 = -((byte)((bVar13 < bVar103) * bVar13 | (bVar13 >= bVar103) * bVar103) == bVar13)
          ;
          cVar106 = -((byte)((bVar14 < bVar105) * bVar14 | (bVar14 >= bVar105) * bVar105) == bVar14)
          ;
          cVar107 = -((byte)((bVar15 < bVar19) * bVar15 | (bVar15 >= bVar19) * bVar19) == bVar15);
          cVar108 = -((char)((ulong)uVar8 >> 0x20) == '\0');
          cVar109 = -((char)((ulong)uVar8 >> 0x28) == '\0');
          cVar110 = -((char)((ulong)uVar8 >> 0x30) == '\0');
          bVar112 = -((char)((ulong)uVar8 >> 0x38) == '\0');
          auVar89._0_9_ = CONCAT18(0xff,(ulong)bVar112 << 0x38);
          auVar81._0_10_ = CONCAT19(0xff,auVar89._0_9_);
          auVar81[10] = 0xff;
          auVar82[0xb] = 0xff;
          auVar82._0_11_ = auVar81;
          auVar83[0xc] = 0xff;
          auVar83._0_12_ = auVar82;
          auVar94[0xd] = 0xff;
          auVar94._0_13_ = auVar83;
          fVar248 = *(float *)(uVar73 + 0x38 + lVar56);
          fVar227 = *(float *)(uVar73 + 0x3c + lVar56);
          fVar217 = *(float *)(uVar73 + 0x44 + lVar56);
          uVar62 = *(uint *)(local_10e8 + 0x20 + root.ptr);
          auVar24[0xc] = (char)(uVar62 >> 0x18);
          auVar24._0_12_ = ZEXT712(0);
          uVar52 = *(undefined4 *)(local_10f0 + 0x20 + root.ptr);
          uVar70 = (ulong)(ushort)uVar52 & 0xffffffffffff00ff;
          auVar25._8_4_ = 0;
          auVar25._0_8_ = uVar70;
          auVar25[0xc] = (char)((uint)uVar52 >> 0x18);
          auVar26[8] = (char)((uint)uVar52 >> 0x10);
          auVar26._0_8_ = uVar70;
          auVar26[9] = 0;
          auVar26._10_3_ = auVar25._10_3_;
          auVar39._5_8_ = 0;
          auVar39._0_5_ = auVar26._8_5_;
          auVar27[4] = (char)((uint)uVar52 >> 8);
          auVar27._0_4_ = (int)uVar70;
          auVar27[5] = 0;
          auVar27._6_7_ = SUB137(auVar39 << 0x40,6);
          fVar189 = *(float *)(uVar73 + 0x48 + lVar56);
          uVar65 = *(uint *)(local_10f8 + 0x20 + root.ptr);
          auVar28[0xc] = (char)(uVar65 >> 0x18);
          auVar28._0_12_ = ZEXT812(0);
          auVar29._10_3_ = auVar28._10_3_;
          auVar29._0_10_ = (unkuint10)(byte)(uVar65 >> 0x10) << 0x40;
          uVar52 = *(undefined4 *)(local_1100 + 0x20 + root.ptr);
          uVar72 = (ulong)(ushort)uVar52 & 0xffffffffffff00ff;
          auVar30._8_4_ = 0;
          auVar30._0_8_ = uVar72;
          auVar30[0xc] = (char)((uint)uVar52 >> 0x18);
          auVar31[8] = (char)((uint)uVar52 >> 0x10);
          auVar31._0_8_ = uVar72;
          auVar31[9] = 0;
          auVar31._10_3_ = auVar30._10_3_;
          auVar40._5_8_ = 0;
          auVar40._0_5_ = auVar31._8_5_;
          auVar32[4] = (char)((uint)uVar52 >> 8);
          auVar32._0_4_ = (int)uVar72;
          auVar32[5] = 0;
          auVar32._6_7_ = SUB137(auVar40 << 0x40,6);
          fVar234 = *(float *)(uVar73 + 0x4c + lVar56);
          uVar52 = *(undefined4 *)(local_1108 + 0x20 + root.ptr);
          uVar74 = (ulong)(ushort)uVar52 & 0xffffffffffff00ff;
          auVar33._8_4_ = 0;
          auVar33._0_8_ = uVar74;
          auVar33[0xc] = (char)((uint)uVar52 >> 0x18);
          auVar34[8] = (char)((uint)uVar52 >> 0x10);
          auVar34._0_8_ = uVar74;
          auVar34[9] = 0;
          auVar34._10_3_ = auVar33._10_3_;
          auVar41._5_8_ = 0;
          auVar41._0_5_ = auVar34._8_5_;
          auVar35[4] = (char)((uint)uVar52 >> 8);
          auVar35._0_4_ = (int)uVar74;
          auVar35[5] = 0;
          auVar35._6_7_ = SUB137(auVar41 << 0x40,6);
          local_10c8 = root.ptr;
          uVar52 = *(undefined4 *)(local_1110 + 0x20 + root.ptr);
          uVar61 = (ulong)(ushort)uVar52 & 0xffffffffffff00ff;
          auVar36._8_4_ = 0;
          auVar36._0_8_ = uVar61;
          auVar36[0xc] = (char)((uint)uVar52 >> 0x18);
          auVar37[8] = (char)((uint)uVar52 >> 0x10);
          auVar37._0_8_ = uVar61;
          auVar37[9] = 0;
          auVar37._10_3_ = auVar36._10_3_;
          auVar42._5_8_ = 0;
          auVar42._0_5_ = auVar37._8_5_;
          auVar38[4] = (char)((uint)uVar52 >> 8);
          auVar38._0_4_ = (int)uVar61;
          auVar38[5] = 0;
          auVar38._6_7_ = SUB137(auVar42 << 0x40,6);
          fVar140 = *(float *)(uVar73 + 0x40 + lVar56);
          auVar118._0_4_ = (((float)(uVar62 & 0xff) * fVar217 + fVar248) - local_1168) * fVar5;
          auVar118._4_4_ = (((float)(uVar62 >> 8 & 0xff) * fVar217 + fVar248) - fStack_1164) * fVar5
          ;
          auVar118._8_4_ =
               (((float)(int)CONCAT32(auVar24._10_3_,(ushort)(byte)(uVar62 >> 0x10)) * fVar217 +
                fVar248) - fStack_1160) * fVar5;
          auVar118._12_4_ =
               (((float)(uint3)(auVar24._10_3_ >> 0x10) * fVar217 + fVar248) - fStack_115c) * fVar5;
          auVar179._0_4_ = (((float)(uVar65 & 0xff) * fVar189 + fVar227) - fVar4) * fVar230;
          auVar179._4_4_ = (((float)(uVar65 >> 8 & 0xff) * fVar189 + fVar227) - fVar4) * fVar113;
          auVar179._8_4_ = (((float)auVar29._8_4_ * fVar189 + fVar227) - fVar4) * fVar137;
          auVar179._12_4_ =
               (((float)(uint3)(auVar28._10_3_ >> 0x10) * fVar189 + fVar227) - fVar4) * fVar207;
          auVar115 = maxps(auVar118,auVar179);
          auVar145._0_4_ = (((float)(int)uVar70 * fVar217 + fVar248) - local_1168) * fVar5;
          auVar145._4_4_ = (((float)auVar27._4_4_ * fVar217 + fVar248) - fStack_1164) * fVar5;
          auVar145._8_4_ = (((float)auVar26._8_4_ * fVar217 + fVar248) - fStack_1160) * fVar5;
          auVar145._12_4_ =
               (((float)(uint3)(auVar25._10_3_ >> 0x10) * fVar217 + fVar248) - fStack_115c) * fVar5;
          auVar164._0_4_ = (((float)(int)uVar72 * fVar189 + fVar227) - fVar4) * fVar230;
          auVar164._4_4_ = (((float)auVar32._4_4_ * fVar189 + fVar227) - fVar4) * fVar113;
          auVar164._8_4_ = (((float)auVar31._8_4_ * fVar189 + fVar227) - fVar4) * fVar137;
          auVar164._12_4_ =
               (((float)(uint3)(auVar30._10_3_ >> 0x10) * fVar189 + fVar227) - fVar4) * fVar207;
          auVar84 = minps(auVar145,auVar164);
          auVar192._0_4_ = (((float)(int)uVar74 * fVar234 + fVar140) - fVar138) * fVar182;
          auVar192._4_4_ = (((float)auVar35._4_4_ * fVar234 + fVar140) - fVar139) * fVar184;
          auVar192._8_4_ = (((float)auVar34._8_4_ * fVar234 + fVar140) - fVar175) * fVar186;
          auVar192._12_4_ =
               (((float)(uint3)(auVar33._10_3_ >> 0x10) * fVar234 + fVar140) - fVar198) * fVar215;
          auVar16._4_4_ = iVar224;
          auVar16._0_4_ = iVar223;
          auVar16._8_4_ = iVar225;
          auVar16._12_4_ = iVar60;
          auVar142 = maxps(auVar192,auVar16);
          dist.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar115,auVar142);
          auVar199._0_4_ = (((float)(int)uVar61 * fVar234 + fVar140) - fVar138) * fVar182;
          auVar199._4_4_ = (((float)auVar38._4_4_ * fVar234 + fVar140) - fVar139) * fVar184;
          auVar199._8_4_ = (((float)auVar37._8_4_ * fVar234 + fVar140) - fVar175) * fVar186;
          auVar199._12_4_ =
               (((float)(uint3)(auVar36._10_3_ >> 0x10) * fVar234 + fVar140) - fVar198) * fVar215;
          auVar18._4_4_ = iVar252;
          auVar18._0_4_ = iVar249;
          auVar18._8_4_ = iVar255;
          auVar18._12_4_ = iVar258;
          auVar115 = minps(auVar199,auVar18);
          auVar115 = minps(auVar84,auVar115);
          auVar94[0xe] = bVar112;
          auVar94[0xf] = bVar112;
          auVar93._14_2_ = auVar94._14_2_;
          auVar93[0xd] = cVar110;
          auVar93._0_13_ = auVar83;
          auVar92._13_3_ = auVar93._13_3_;
          auVar92[0xc] = cVar110;
          auVar92._0_12_ = auVar82;
          auVar91._12_4_ = auVar92._12_4_;
          auVar91[0xb] = cVar109;
          auVar91._0_11_ = auVar81;
          auVar90._11_5_ = auVar91._11_5_;
          auVar90[10] = cVar109;
          auVar90._0_10_ = auVar81._0_10_;
          auVar89._10_6_ = auVar90._10_6_;
          auVar89[9] = cVar108;
          Var45 = CONCAT91(CONCAT81((long)(CONCAT72(auVar89._9_7_,CONCAT11(cVar108,bVar112)) >> 8),
                                    cVar107),cVar107);
          auVar44._2_10_ = Var45;
          auVar44[1] = cVar106;
          auVar44[0] = cVar106;
          auVar43._2_12_ = auVar44;
          auVar43[1] = cVar104;
          auVar43[0] = cVar104;
          auVar88._0_2_ = CONCAT11(cVar80,cVar80);
          auVar88._2_14_ = auVar43;
          uVar111 = (undefined2)Var45;
          auVar97._0_12_ = auVar88._0_12_;
          auVar97._12_2_ = uVar111;
          auVar97._14_2_ = uVar111;
          auVar96._12_4_ = auVar97._12_4_;
          auVar96._0_10_ = auVar88._0_10_;
          auVar96._10_2_ = auVar44._0_2_;
          auVar95._10_6_ = auVar96._10_6_;
          auVar95._0_8_ = auVar88._0_8_;
          auVar95._8_2_ = auVar44._0_2_;
          auVar46._4_8_ = auVar95._8_8_;
          auVar46._2_2_ = auVar43._0_2_;
          auVar46._0_2_ = auVar43._0_2_;
          uVar62 = CONCAT22(auVar88._0_2_,auVar88._0_2_);
          auVar119._0_4_ = -(uint)(dist.field_0._0_4_ <= auVar115._0_4_) & uVar62;
          auVar119._4_4_ = -(uint)(dist.field_0._4_4_ <= auVar115._4_4_) & auVar46._0_4_;
          auVar119._8_4_ = -(uint)(dist.field_0._8_4_ <= auVar115._8_4_) & auVar95._8_4_;
          auVar119._12_4_ = -(uint)(dist.field_0._12_4_ <= auVar115._12_4_) & auVar96._12_4_;
          uVar62 = movmskps((int)lVar56,auVar119);
          if (uVar62 != 0) {
            local_10c0 = (ulong)(uVar62 & 0xff);
            do {
              sVar12 = 0;
              if (local_10c0 != 0) {
                for (; (local_10c0 >> sVar12 & 1) == 0; sVar12 = sVar12 + 1) {
                }
              }
              fVar248 = *(float *)(ray + k * 4 + 0x80);
              root.ptr = sVar12;
              if (*(float *)((long)&stack[-1].ptr.ptr + sVar12 * 4) <= fVar248) {
                local_1158 = ZEXT416((uint)fVar248);
                uVar62 = *(uint *)(local_10c8 + 0x50);
                root.ptr = (size_t)uVar62;
                uVar65 = *(uint *)(local_10c8 + 4 + sVar12 * 8);
                pSVar57 = context->scene;
                pGVar11 = (pSVar57->geometries).items[root.ptr].ptr;
                lVar56 = *(long *)&pGVar11->field_0x58;
                lVar64 = *(long *)&pGVar11[1].time_range.upper;
                lVar69 = CONCAT44(0,uVar65) *
                         pGVar11[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                         _M_i;
                uVar63 = *(ulong *)(local_10c8 + sVar12 * 8);
                auVar98._8_8_ = 0;
                auVar98._0_8_ = uVar63;
                auVar98 = auVar98 & _DAT_01fab9a0;
                auVar47._10_2_ = 0;
                auVar47._0_10_ = auVar98._0_10_;
                auVar47._12_2_ = auVar98._6_2_;
                auVar48._8_2_ = auVar98._4_2_;
                auVar48._0_8_ = auVar98._0_8_;
                auVar48._10_4_ = auVar47._10_4_;
                auVar165._6_10_ = SUB1610(ZEXT616(auVar48._8_6_) << 0x40,6);
                auVar165._0_4_ = auVar98._0_4_;
                auVar165._4_2_ = auVar98._2_2_;
                local_fe8 = (uint)auVar98._0_2_;
                uVar70 = *(ulong *)(lVar56 + lVar69);
                uVar72 = (ulong)((int)((ulong)(auVar165._0_4_ >> 0x10) * (uVar70 >> 0x20)) +
                                (int)uVar70 + local_fe8);
                p_Var58 = pGVar11[1].intersectionFilterN;
                pfVar3 = (float *)(lVar64 + (long)p_Var58 * uVar72);
                fVar198 = *pfVar3;
                fVar207 = pfVar3[1];
                fVar215 = pfVar3[2];
                pfVar3 = (float *)(lVar64 + (uVar72 + 1) * (long)p_Var58);
                fVar227 = *pfVar3;
                local_f98 = pfVar3[1];
                fVar217 = pfVar3[2];
                uVar70 = uVar70 >> 0x20;
                lVar67 = uVar72 + uVar70 + 1;
                pfVar3 = (float *)(lVar64 + (uVar72 + uVar70) * (long)p_Var58);
                fVar189 = *pfVar3;
                local_1318 = pfVar3[1];
                local_1308 = pfVar3[2];
                pfVar3 = (float *)(lVar64 + lVar67 * (long)p_Var58);
                fVar234 = *pfVar3;
                fVar140 = pfVar3[1];
                fVar158 = pfVar3[2];
                uVar74 = (ulong)(-1 < (short)uVar63);
                pfVar3 = (float *)(lVar64 + (uVar72 + uVar74 + 1) * (long)p_Var58);
                fVar230 = *pfVar3;
                lVar71 = uVar74 + lVar67;
                pfVar1 = (float *)(lVar64 + lVar71 * (long)p_Var58);
                fVar236 = *pfVar1;
                fVar155 = pfVar1[1];
                fVar174 = pfVar1[2];
                uVar74 = 0;
                if (-1 < (short)(uVar63 >> 0x10)) {
                  uVar74 = uVar70;
                }
                pfVar1 = (float *)(lVar64 + (uVar72 + uVar70 + uVar74) * (long)p_Var58);
                fStack_130c = pfVar1[1];
                fStack_12f4 = pfVar1[2];
                pfVar2 = (float *)(lVar64 + (lVar67 + uVar74) * (long)p_Var58);
                fVar157 = pfVar2[1];
                local_12f8 = pfVar2[2];
                fVar156 = *(float *)(lVar64 + (uVar74 + lVar71) * (long)p_Var58 + 4);
                fStack_f94 = pfVar3[1];
                fStack_f90 = fVar155;
                fStack_f8c = fVar140;
                fVar246 = fVar207 - local_f98;
                fVar250 = local_f98 - pfVar3[1];
                fVar253 = fVar140 - fVar155;
                fVar256 = local_1318 - fVar140;
                fVar175 = fVar215 - fVar217;
                fVar182 = fVar217 - pfVar3[2];
                fVar184 = fVar158 - fVar174;
                fVar186 = local_1308 - fVar158;
                fVar259 = local_1318 - fVar207;
                fVar260 = fVar140 - local_f98;
                fVar261 = fVar157 - fVar140;
                fVar262 = fStack_130c - local_1318;
                fVar188 = local_1308 - fVar215;
                fVar195 = fVar158 - fVar217;
                fVar196 = local_12f8 - fVar158;
                fVar197 = fStack_12f4 - local_1308;
                local_1198[0] = fVar175 * fVar259 - fVar246 * fVar188;
                local_1198[1] = fVar182 * fVar260 - fVar250 * fVar195;
                fStack_1140 = fVar184 * fVar261 - fVar253 * fVar196;
                fStack_113c = fVar186 * fVar262 - fVar256 * fVar197;
                local_1148 = CONCAT44(local_1198[1],local_1198[0]);
                tNear.field_0.v[1] = *pfVar1;
                tNear.field_0.v[0] = *pfVar2;
                fVar233 = fVar189 - fVar198;
                fVar235 = fVar234 - fVar227;
                fVar237 = *pfVar2 - fVar234;
                fVar238 = *pfVar1 - fVar189;
                fStack_135c = *(float *)(ray + k * 4);
                fStack_123c = *(float *)(ray + k * 4 + 0x10);
                local_12a8._4_4_ = *(undefined4 *)(ray + k * 4 + 0x40);
                fStack_131c = *(float *)(ray + k * 4 + 0x50);
                local_fb8 = fVar198 - fStack_135c;
                fStack_fb4 = fVar227 - fStack_135c;
                fStack_fb0 = fVar234 - fStack_135c;
                fStack_fac = fVar189 - fStack_135c;
                fVar207 = fVar207 - fStack_123c;
                fVar212 = local_f98 - fStack_123c;
                fVar213 = fVar140 - fStack_123c;
                fVar214 = local_1318 - fStack_123c;
                fVar226 = local_fb8 * fStack_131c - fVar207 * (float)local_12a8._4_4_;
                fVar229 = fStack_fb4 * fStack_131c - fVar212 * (float)local_12a8._4_4_;
                fVar231 = fStack_fb0 * fStack_131c - fVar213 * (float)local_12a8._4_4_;
                fVar232 = fStack_fac * fStack_131c - fVar214 * (float)local_12a8._4_4_;
                fVar198 = fVar198 - fVar227;
                fVar204 = fVar227 - fVar230;
                fVar205 = fVar234 - fStack_1350;
                fVar206 = fVar189 - fStack_134c;
                fVar113 = fVar198 * fVar188 - fVar175 * fVar233;
                fVar137 = fVar204 * fVar195 - fVar182 * fVar235;
                fVar138 = fVar205 * fVar196 - fVar184 * fVar237;
                fVar139 = fVar206 * fVar197 - fVar186 * fVar238;
                fStack_12ac = *(float *)(ray + k * 4 + 0x20);
                fStack_124c = *(float *)(ray + k * 4 + 0x60);
                fVar215 = fVar215 - fStack_12ac;
                fVar217 = fVar217 - fStack_12ac;
                fVar219 = fVar158 - fStack_12ac;
                fVar221 = local_1308 - fStack_12ac;
                fVar216 = fVar215 * (float)local_12a8._4_4_ - local_fb8 * fStack_124c;
                fVar218 = fVar217 * (float)local_12a8._4_4_ - fStack_fb4 * fStack_124c;
                fVar220 = fVar219 * (float)local_12a8._4_4_ - fStack_fb0 * fStack_124c;
                fVar222 = fVar221 * (float)local_12a8._4_4_ - fStack_fac * fStack_124c;
                local_1178._0_4_ = fVar246 * fVar233 - fVar198 * fVar259;
                local_1178._4_4_ = fVar250 * fVar235 - fVar204 * fVar260;
                local_1178._8_4_ = fVar253 * fVar237 - fVar205 * fVar261;
                local_1178._12_4_ = fVar256 * fVar238 - fVar206 * fVar262;
                fVar247 = fVar207 * fStack_124c - fVar215 * fStack_131c;
                fVar251 = fVar212 * fStack_124c - fVar217 * fStack_131c;
                fVar254 = fVar213 * fStack_124c - fVar219 * fStack_131c;
                fVar257 = fVar214 * fStack_124c - fVar221 * fStack_131c;
                local_12a8._0_4_ = local_12a8._4_4_;
                fStack_12a0 = (float)local_12a8._4_4_;
                fStack_129c = (float)local_12a8._4_4_;
                fVar242 = local_1198[0] * (float)local_12a8._4_4_ +
                          fVar113 * fStack_131c + (float)local_1178._0_4_ * fStack_124c;
                fVar243 = local_1198[1] * (float)local_12a8._4_4_ +
                          fVar137 * fStack_131c + (float)local_1178._4_4_ * fStack_124c;
                fVar244 = fStack_1140 * (float)local_12a8._4_4_ +
                          fVar138 * fStack_131c + (float)local_1178._8_4_ * fStack_124c;
                fVar245 = fStack_113c * (float)local_12a8._4_4_ +
                          fVar139 * fStack_131c + (float)local_1178._12_4_ * fStack_124c;
                uVar176 = (uint)fVar242 & 0x80000000;
                uVar183 = (uint)fVar243 & 0x80000000;
                uVar185 = (uint)fVar244 & 0x80000000;
                uVar187 = (uint)fVar245 & 0x80000000;
                fVar188 = (float)((uint)(fVar233 * fVar247 + fVar259 * fVar216 + fVar188 * fVar226)
                                 ^ uVar176);
                fVar195 = (float)((uint)(fVar235 * fVar251 + fVar260 * fVar218 + fVar195 * fVar229)
                                 ^ uVar183);
                fVar196 = (float)((uint)(fVar237 * fVar254 + fVar261 * fVar220 + fVar196 * fVar231)
                                 ^ uVar185);
                fVar197 = (float)((uint)(fVar238 * fVar257 + fVar262 * fVar222 + fVar197 * fVar232)
                                 ^ uVar187);
                fVar216 = (float)((uint)(fVar247 * fVar198 + fVar216 * fVar246 + fVar226 * fVar175)
                                 ^ uVar176);
                fVar182 = (float)((uint)(fVar251 * fVar204 + fVar218 * fVar250 + fVar229 * fVar182)
                                 ^ uVar183);
                fVar184 = (float)((uint)(fVar254 * fVar205 + fVar220 * fVar253 + fVar231 * fVar184)
                                 ^ uVar185);
                fVar186 = (float)((uint)(fVar257 * fVar206 + fVar222 * fVar256 + fVar232 * fVar186)
                                 ^ uVar187);
                fVar198 = ABS(fVar242);
                fVar175 = ABS(fVar243);
                auVar193._0_8_ = CONCAT44(fVar243,fVar242) & 0x7fffffff7fffffff;
                auVar193._8_4_ = ABS(fVar244);
                auVar193._12_4_ = ABS(fVar245);
                bVar22 = ((0.0 <= fVar188 && 0.0 <= fVar216) && fVar242 != 0.0) &&
                         fVar188 + fVar216 <= fVar198;
                auVar228._0_4_ = -(uint)bVar22;
                bVar23 = ((0.0 <= fVar195 && 0.0 <= fVar182) && fVar243 != 0.0) &&
                         fVar195 + fVar182 <= fVar175;
                auVar228._4_4_ = -(uint)bVar23;
                bVar21 = ((0.0 <= fVar196 && 0.0 <= fVar184) && fVar244 != 0.0) &&
                         fVar196 + fVar184 <= auVar193._8_4_;
                auVar228._8_4_ = -(uint)bVar21;
                bVar20 = ((0.0 <= fVar197 && 0.0 <= fVar186) && fVar245 != 0.0) &&
                         fVar197 + fVar186 <= auVar193._12_4_;
                auVar228._12_4_ = -(uint)bVar20;
                iVar60 = movmskps((int)lVar64,auVar228);
                iStack_1134 = auVar165._4_4_;
                local_10b8 = ZEXT416(uVar65);
                local_ff8 = ZEXT416(uVar62);
                local_1138 = iStack_1134;
                iStack_1130 = iStack_1134;
                iStack_112c = iStack_1134;
                uStack_fe4 = local_fe8;
                uStack_fe0 = local_fe8;
                uStack_fdc = local_fe8;
                fStack_1314 = fVar140;
                fStack_1310 = fVar157;
                fStack_12f0 = fVar174;
                fStack_12ec = fVar158;
                if (iVar60 == 0) {
LAB_0020bfb9:
                  uVar62 = (uint)pSVar57;
                  auVar200._4_4_ = fStack_12ac;
                  auVar200._0_4_ = fStack_12ac;
                  auVar200._8_4_ = fStack_12ac;
                  auVar200._12_4_ = fStack_12ac;
                  fVar248 = local_1308;
                  fVar198 = fVar158;
                }
                else {
                  fVar217 = fVar217 * (float)local_1178._4_4_;
                  fVar219 = fVar219 * (float)local_1178._8_4_;
                  fVar221 = fVar221 * (float)local_1178._12_4_;
                  local_1328 = (float)(uVar176 ^
                                      (uint)(local_fb8 * local_1198[0] +
                                            fVar207 * fVar113 + fVar215 * (float)local_1178._0_4_));
                  fStack_1324 = (float)(uVar183 ^
                                       (uint)(fStack_fb4 * local_1198[1] +
                                             fVar212 * fVar137 + fVar217));
                  fStack_1320 = (float)(uVar185 ^
                                       (uint)(fStack_fb0 * fStack_1140 + fVar213 * fVar138 + fVar219
                                             ));
                  local_11a8[3] =
                       (float)(uVar187 ^
                              (uint)(fStack_fac * fStack_113c + fVar214 * fVar139 + fVar221));
                  fVar207 = *(float *)(ray + k * 4 + 0x30);
                  valid.field_0.i[0] =
                       -(uint)((fVar207 * fVar198 < local_1328 && local_1328 <= fVar248 * fVar198)
                              && bVar22);
                  valid.field_0.i[1] =
                       -(uint)((fVar207 * fVar175 < fStack_1324 && fStack_1324 <= fVar248 * fVar175)
                              && bVar23);
                  valid.field_0.i[2] =
                       -(uint)((fVar207 * auVar193._8_4_ < fStack_1320 &&
                               fStack_1320 <= fVar248 * auVar193._8_4_) && bVar21);
                  valid.field_0.i[3] =
                       -(uint)((fVar207 * auVar193._12_4_ < local_11a8[3] &&
                               local_11a8[3] <= fVar248 * auVar193._12_4_) && bVar20);
                  iVar60 = movmskps(iVar60,(undefined1  [16])valid.field_0);
                  if (iVar60 == 0) goto LAB_0020bfb9;
                  local_1198[2] = fStack_1140;
                  local_1198[3] = fStack_113c;
                  local_1188 = CONCAT44(fVar137,fVar113);
                  uStack_1180 = CONCAT44(fVar139,fVar138);
                  auVar167._4_12_ = local_1178._4_12_;
                  auVar167._0_4_ = (float)(int)(*(ushort *)(lVar56 + 8 + lVar69) - 1);
                  auVar239._4_4_ = local_1178._4_4_;
                  auVar239._0_4_ = auVar167._0_4_;
                  auVar239._8_4_ = local_1178._8_4_;
                  auVar239._12_4_ = local_1178._12_4_;
                  auVar115 = rcpss(auVar239,auVar167);
                  fVar207 = (float)(int)(*(ushort *)(lVar56 + 10 + lVar69) - 1);
                  fVar248 = (2.0 - auVar167._0_4_ * auVar115._0_4_) * auVar115._0_4_;
                  auVar240._4_4_ = fVar217;
                  auVar240._0_4_ = fVar207;
                  auVar240._8_4_ = fVar219;
                  auVar240._12_4_ = fVar221;
                  auVar17._4_4_ = fVar217;
                  auVar17._0_4_ = fVar207;
                  auVar17._8_4_ = fVar219;
                  auVar17._12_4_ = fVar221;
                  auVar115 = rcpss(auVar240,auVar17);
                  fVar207 = (2.0 - fVar207 * auVar115._0_4_) * auVar115._0_4_;
                  tNear.field_0.v[0] = fVar248 * ((float)local_fe8 * fVar198 + fVar188);
                  tNear.field_0.v[1] = fVar248 * ((float)(local_fe8 + 1) * fVar175 + fVar195);
                  tNear.field_0.v[2] = fVar248 * ((float)(local_fe8 + 1) * auVar193._8_4_ + fVar196)
                  ;
                  tNear.field_0.v[3] = fVar248 * ((float)local_fe8 * auVar193._12_4_ + fVar197);
                  auVar120._0_4_ = (float)iStack_1134 * fVar198 + fVar216;
                  auVar120._4_4_ = (float)iStack_1134 * fVar175 + fVar182;
                  auVar120._8_4_ = (float)(iStack_1134 + 1) * auVar193._8_4_ + fVar184;
                  auVar120._12_4_ = (float)(iStack_1134 + 1) * auVar193._12_4_ + fVar186;
                  pGVar11 = (pSVar57->geometries).items[root.ptr].ptr;
                  uVar176 = *(uint *)(ray + k * 4 + 0x90);
                  pSVar57 = (Scene *)(ulong)uVar176;
                  if ((pGVar11->mask & uVar176) == 0) goto LAB_0020bfb9;
                  auVar115 = rcpps(auVar120,auVar193);
                  fVar248 = auVar115._0_4_;
                  fVar215 = auVar115._4_4_;
                  fVar217 = auVar115._8_4_;
                  fVar113 = auVar115._12_4_;
                  fVar248 = (1.0 - fVar198 * fVar248) * fVar248 + fVar248;
                  fVar215 = (1.0 - fVar175 * fVar215) * fVar215 + fVar215;
                  fVar217 = (1.0 - auVar193._8_4_ * fVar217) * fVar217 + fVar217;
                  fVar113 = (1.0 - auVar193._12_4_ * fVar113) * fVar113 + fVar113;
                  local_1328 = local_1328 * fVar248;
                  fStack_1324 = fStack_1324 * fVar215;
                  fStack_1320 = fStack_1320 * fVar217;
                  local_11a8[3] = local_11a8[3] * fVar113;
                  local_11a8[0] = local_1328;
                  local_11a8[1] = fStack_1324;
                  local_11a8[2] = fStack_1320;
                  local_11c8[0] = tNear.field_0.v[0] * fVar248;
                  local_11c8[1] = tNear.field_0.v[1] * fVar215;
                  local_11c8[2] = tNear.field_0.v[2] * fVar217;
                  local_11c8[3] = tNear.field_0.v[3] * fVar113;
                  local_11b8[0] = fVar207 * auVar120._0_4_ * fVar248;
                  local_11b8[1] = fVar207 * auVar120._4_4_ * fVar215;
                  local_11b8[2] = fVar207 * auVar120._8_4_ * fVar217;
                  local_11b8[3] = fVar207 * auVar120._12_4_ * fVar113;
                  auVar121._0_4_ = (uint)local_1328 & valid.field_0.i[0];
                  auVar121._4_4_ = (uint)fStack_1324 & valid.field_0.i[1];
                  auVar121._8_4_ = (uint)fStack_1320 & valid.field_0.i[2];
                  auVar121._12_4_ = (uint)local_11a8[3] & valid.field_0.i[3];
                  auVar168._0_8_ =
                       CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) & 0x7f8000007f800000;
                  auVar168._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
                  auVar168._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
                  auVar168 = auVar168 | auVar121;
                  auVar122._4_4_ = auVar168._0_4_;
                  auVar122._0_4_ = auVar168._4_4_;
                  auVar122._8_4_ = auVar168._12_4_;
                  auVar122._12_4_ = auVar168._8_4_;
                  auVar115 = minps(auVar122,auVar168);
                  auVar146._0_8_ = auVar115._8_8_;
                  auVar146._8_4_ = auVar115._0_4_;
                  auVar146._12_4_ = auVar115._4_4_;
                  auVar115 = minps(auVar146,auVar115);
                  uVar75 = -(uint)(auVar115._0_4_ == auVar168._0_4_);
                  uVar76 = -(uint)(auVar115._4_4_ == auVar168._4_4_);
                  uVar78 = -(uint)(auVar115._8_4_ == auVar168._8_4_);
                  uVar77 = -(uint)(auVar115._12_4_ == auVar168._12_4_);
                  auVar123._0_4_ = uVar75 & valid.field_0.i[0];
                  auVar123._4_4_ = uVar76 & valid.field_0.i[1];
                  auVar123._8_4_ = uVar78 & valid.field_0.i[2];
                  auVar123._12_4_ = uVar77 & valid.field_0.i[3];
                  iVar60 = movmskps(uVar176,auVar123);
                  uVar176 = 0xffffffff;
                  uVar183 = 0xffffffff;
                  uVar185 = 0xffffffff;
                  uVar187 = 0xffffffff;
                  if (iVar60 != 0) {
                    uVar176 = uVar75;
                    uVar183 = uVar76;
                    uVar185 = uVar78;
                    uVar187 = uVar77;
                  }
                  auVar209._0_4_ = valid.field_0.i[0] & uVar176;
                  auVar209._4_4_ = valid.field_0.i[1] & uVar183;
                  auVar209._8_4_ = valid.field_0.i[2] & uVar185;
                  auVar209._12_4_ = valid.field_0.i[3] & uVar187;
                  uVar176 = movmskps(iVar60,auVar209);
                  lVar64 = 0;
                  if (uVar176 != 0) {
                    for (; (uVar176 >> lVar64 & 1) == 0; lVar64 = lVar64 + 1) {
                    }
                  }
                  fStack_1304 = fVar158;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar248 = local_11c8[lVar64];
                    fVar198 = local_11b8[lVar64];
                    fVar207 = local_1198[lVar64];
                    uVar52 = *(undefined4 *)((long)&local_1188 + lVar64 * 4);
                    uVar6 = *(undefined4 *)(local_1178 + lVar64 * 4);
                    *(float *)(ray + k * 4 + 0x80) = local_11a8[lVar64];
                    *(float *)(ray + k * 4 + 0xc0) = fVar207;
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar52;
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar6;
                    *(float *)(ray + k * 4 + 0xf0) = fVar248;
                    *(float *)(ray + k * 4 + 0x100) = fVar198;
                    *(uint *)(ray + k * 4 + 0x110) = uVar65;
                    *(uint *)(ray + k * 4 + 0x120) = uVar62;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    uVar62 = context->user->instPrimID[0];
                    *(uint *)(ray + k * 4 + 0x140) = uVar62;
                  }
                  else {
                    local_1158._8_8_ = 0;
                    local_1158._0_8_ = CONCAT44(0,uVar65);
                    local_1148 = root.ptr;
                    auVar44 = *(undefined1 (*) [12])(mm_lookupmask_ps + lVar54);
                    fStack_124c = (float)((ulong)*(undefined8 *)(mm_lookupmask_ps + lVar54 + 8) >>
                                         0x20);
                    _local_12a8 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                    auVar210._8_4_ = 0xffffffff;
                    auVar210._0_8_ = 0xffffffffffffffff;
                    auVar210._12_4_ = 0xffffffff;
                    fStack_131c = local_11a8[3];
                    while( true ) {
                      local_1058 = local_11c8[lVar64];
                      local_1048._4_4_ = local_11b8[lVar64];
                      *(float *)(ray + k * 4 + 0x80) = local_11a8[lVar64];
                      args.context = context->user;
                      local_1088 = local_1198[lVar64];
                      local_1078._4_4_ = *(undefined4 *)((long)&local_1188 + lVar64 * 4);
                      local_1068._4_4_ = *(undefined4 *)(local_1178 + lVar64 * 4);
                      fStack_1084 = local_1088;
                      fStack_1080 = local_1088;
                      fStack_107c = local_1088;
                      local_1078._0_4_ = local_1078._4_4_;
                      local_1078._8_4_ = local_1078._4_4_;
                      local_1078._12_4_ = local_1078._4_4_;
                      local_1068._0_4_ = local_1068._4_4_;
                      local_1068._8_4_ = local_1068._4_4_;
                      local_1068._12_4_ = local_1068._4_4_;
                      fStack_1054 = local_1058;
                      fStack_1050 = local_1058;
                      fStack_104c = local_1058;
                      local_1048._0_4_ = local_1048._4_4_;
                      fStack_1040 = (float)local_1048._4_4_;
                      fStack_103c = (float)local_1048._4_4_;
                      local_1038 = CONCAT44(uVar65,uVar65);
                      uStack_1030 = CONCAT44(uVar65,uVar65);
                      local_1028 = CONCAT44(uVar62,uVar62);
                      uStack_1020 = CONCAT44(uVar62,uVar62);
                      uStack_1014 = (args.context)->instID[0];
                      local_1018 = uStack_1014;
                      uStack_1010 = uStack_1014;
                      uStack_100c = uStack_1014;
                      uStack_1004 = (args.context)->instPrimID[0];
                      local_1008 = uStack_1004;
                      uStack_1000 = uStack_1004;
                      uStack_ffc = uStack_1004;
                      local_1338._12_4_ = fStack_124c;
                      local_1338._0_12_ = auVar44;
                      args.valid = (int *)local_1338;
                      args.geometryUserPtr = pGVar11->userPtr;
                      args.hit = (RTCHitN *)&local_1088;
                      args.N = 4;
                      p_Var58 = pGVar11->intersectionFilterN;
                      args.ray = (RTCRayN *)ray;
                      if (p_Var58 != (RTCFilterFunctionN)0x0) {
                        p_Var58 = (RTCFilterFunctionN)(*p_Var58)(&args);
                        auVar210._8_4_ = 0xffffffff;
                        auVar210._0_8_ = 0xffffffffffffffff;
                        auVar210._12_4_ = 0xffffffff;
                      }
                      auVar127._0_4_ = -(uint)(local_1338._0_4_ == 0);
                      auVar127._4_4_ = -(uint)(local_1338._4_4_ == 0);
                      auVar127._8_4_ = -(uint)(local_1338._8_4_ == 0);
                      auVar127._12_4_ = -(uint)(local_1338._12_4_ == 0);
                      uVar176 = movmskps((int)p_Var58,auVar127);
                      pRVar59 = (RTCRayN *)(ulong)(uVar176 ^ 0xf);
                      if ((uVar176 ^ 0xf) == 0) {
                        auVar127 = auVar127 ^ auVar210;
                      }
                      else {
                        p_Var58 = context->args->filter;
                        if ((p_Var58 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                          p_Var58 = (RTCFilterFunctionN)(*p_Var58)(&args);
                          auVar210._8_4_ = 0xffffffff;
                          auVar210._0_8_ = 0xffffffffffffffff;
                          auVar210._12_4_ = 0xffffffff;
                        }
                        auVar99._0_4_ = -(uint)(local_1338._0_4_ == 0);
                        auVar99._4_4_ = -(uint)(local_1338._4_4_ == 0);
                        auVar99._8_4_ = -(uint)(local_1338._8_4_ == 0);
                        auVar99._12_4_ = -(uint)(local_1338._12_4_ == 0);
                        auVar127 = auVar99 ^ auVar210;
                        uVar176 = movmskps((int)p_Var58,auVar99);
                        pRVar59 = (RTCRayN *)(ulong)(uVar176 ^ 0xf);
                        if ((uVar176 ^ 0xf) != 0) {
                          uVar176 = *(uint *)(args.hit + 4);
                          uVar183 = *(uint *)(args.hit + 8);
                          uVar185 = *(uint *)(args.hit + 0xc);
                          *(uint *)(args.ray + 0xc0) =
                               ~auVar99._0_4_ & *(uint *)args.hit |
                               *(uint *)(args.ray + 0xc0) & auVar99._0_4_;
                          *(uint *)(args.ray + 0xc4) =
                               ~auVar99._4_4_ & uVar176 | *(uint *)(args.ray + 0xc4) & auVar99._4_4_
                          ;
                          *(uint *)(args.ray + 200) =
                               ~auVar99._8_4_ & uVar183 | *(uint *)(args.ray + 200) & auVar99._8_4_;
                          *(uint *)(args.ray + 0xcc) =
                               ~auVar99._12_4_ & uVar185 |
                               *(uint *)(args.ray + 0xcc) & auVar99._12_4_;
                          uVar176 = *(uint *)(args.hit + 0x14);
                          uVar183 = *(uint *)(args.hit + 0x18);
                          uVar185 = *(uint *)(args.hit + 0x1c);
                          *(uint *)(args.ray + 0xd0) =
                               ~auVar99._0_4_ & *(uint *)(args.hit + 0x10) |
                               *(uint *)(args.ray + 0xd0) & auVar99._0_4_;
                          *(uint *)(args.ray + 0xd4) =
                               ~auVar99._4_4_ & uVar176 | *(uint *)(args.ray + 0xd4) & auVar99._4_4_
                          ;
                          *(uint *)(args.ray + 0xd8) =
                               ~auVar99._8_4_ & uVar183 | *(uint *)(args.ray + 0xd8) & auVar99._8_4_
                          ;
                          *(uint *)(args.ray + 0xdc) =
                               ~auVar99._12_4_ & uVar185 |
                               *(uint *)(args.ray + 0xdc) & auVar99._12_4_;
                          uVar176 = *(uint *)(args.hit + 0x24);
                          uVar183 = *(uint *)(args.hit + 0x28);
                          uVar185 = *(uint *)(args.hit + 0x2c);
                          *(uint *)(args.ray + 0xe0) =
                               ~auVar99._0_4_ & *(uint *)(args.hit + 0x20) |
                               *(uint *)(args.ray + 0xe0) & auVar99._0_4_;
                          *(uint *)(args.ray + 0xe4) =
                               ~auVar99._4_4_ & uVar176 | *(uint *)(args.ray + 0xe4) & auVar99._4_4_
                          ;
                          *(uint *)(args.ray + 0xe8) =
                               ~auVar99._8_4_ & uVar183 | *(uint *)(args.ray + 0xe8) & auVar99._8_4_
                          ;
                          *(uint *)(args.ray + 0xec) =
                               ~auVar99._12_4_ & uVar185 |
                               *(uint *)(args.ray + 0xec) & auVar99._12_4_;
                          uVar176 = *(uint *)(args.hit + 0x34);
                          uVar183 = *(uint *)(args.hit + 0x38);
                          uVar185 = *(uint *)(args.hit + 0x3c);
                          *(uint *)(args.ray + 0xf0) =
                               ~auVar99._0_4_ & *(uint *)(args.hit + 0x30) |
                               *(uint *)(args.ray + 0xf0) & auVar99._0_4_;
                          *(uint *)(args.ray + 0xf4) =
                               ~auVar99._4_4_ & uVar176 | *(uint *)(args.ray + 0xf4) & auVar99._4_4_
                          ;
                          *(uint *)(args.ray + 0xf8) =
                               ~auVar99._8_4_ & uVar183 | *(uint *)(args.ray + 0xf8) & auVar99._8_4_
                          ;
                          *(uint *)(args.ray + 0xfc) =
                               ~auVar99._12_4_ & uVar185 |
                               *(uint *)(args.ray + 0xfc) & auVar99._12_4_;
                          uVar176 = *(uint *)(args.hit + 0x44);
                          uVar183 = *(uint *)(args.hit + 0x48);
                          uVar185 = *(uint *)(args.hit + 0x4c);
                          *(uint *)(args.ray + 0x100) =
                               ~auVar99._0_4_ & *(uint *)(args.hit + 0x40) |
                               *(uint *)(args.ray + 0x100) & auVar99._0_4_;
                          *(uint *)(args.ray + 0x104) =
                               ~auVar99._4_4_ & uVar176 |
                               *(uint *)(args.ray + 0x104) & auVar99._4_4_;
                          *(uint *)(args.ray + 0x108) =
                               ~auVar99._8_4_ & uVar183 |
                               *(uint *)(args.ray + 0x108) & auVar99._8_4_;
                          *(uint *)(args.ray + 0x10c) =
                               ~auVar99._12_4_ & uVar185 |
                               *(uint *)(args.ray + 0x10c) & auVar99._12_4_;
                          uVar176 = *(uint *)(args.hit + 0x54);
                          uVar183 = *(uint *)(args.hit + 0x58);
                          uVar185 = *(uint *)(args.hit + 0x5c);
                          *(uint *)(args.ray + 0x110) =
                               *(uint *)(args.ray + 0x110) & auVar99._0_4_ |
                               ~auVar99._0_4_ & *(uint *)(args.hit + 0x50);
                          *(uint *)(args.ray + 0x114) =
                               *(uint *)(args.ray + 0x114) & auVar99._4_4_ |
                               ~auVar99._4_4_ & uVar176;
                          *(uint *)(args.ray + 0x118) =
                               *(uint *)(args.ray + 0x118) & auVar99._8_4_ |
                               ~auVar99._8_4_ & uVar183;
                          *(uint *)(args.ray + 0x11c) =
                               *(uint *)(args.ray + 0x11c) & auVar99._12_4_ |
                               ~auVar99._12_4_ & uVar185;
                          uVar176 = *(uint *)(args.hit + 100);
                          uVar183 = *(uint *)(args.hit + 0x68);
                          uVar185 = *(uint *)(args.hit + 0x6c);
                          *(uint *)(args.ray + 0x120) =
                               *(uint *)(args.ray + 0x120) & auVar99._0_4_ |
                               ~auVar99._0_4_ & *(uint *)(args.hit + 0x60);
                          *(uint *)(args.ray + 0x124) =
                               *(uint *)(args.ray + 0x124) & auVar99._4_4_ |
                               ~auVar99._4_4_ & uVar176;
                          *(uint *)(args.ray + 0x128) =
                               *(uint *)(args.ray + 0x128) & auVar99._8_4_ |
                               ~auVar99._8_4_ & uVar183;
                          *(uint *)(args.ray + 300) =
                               *(uint *)(args.ray + 300) & auVar99._12_4_ |
                               ~auVar99._12_4_ & uVar185;
                          uVar176 = *(uint *)(args.hit + 0x74);
                          uVar183 = *(uint *)(args.hit + 0x78);
                          uVar185 = *(uint *)(args.hit + 0x7c);
                          *(uint *)(args.ray + 0x130) =
                               ~auVar99._0_4_ & *(uint *)(args.hit + 0x70) |
                               *(uint *)(args.ray + 0x130) & auVar99._0_4_;
                          *(uint *)(args.ray + 0x134) =
                               ~auVar99._4_4_ & uVar176 |
                               *(uint *)(args.ray + 0x134) & auVar99._4_4_;
                          *(uint *)(args.ray + 0x138) =
                               ~auVar99._8_4_ & uVar183 |
                               *(uint *)(args.ray + 0x138) & auVar99._8_4_;
                          *(uint *)(args.ray + 0x13c) =
                               ~auVar99._12_4_ & uVar185 |
                               *(uint *)(args.ray + 0x13c) & auVar99._12_4_;
                          *(undefined1 (*) [16])(args.ray + 0x140) =
                               ~auVar99 & *(undefined1 (*) [16])(args.hit + 0x80) |
                               *(undefined1 (*) [16])(args.ray + 0x140) & auVar99;
                          pRVar59 = args.ray;
                        }
                      }
                      fVar215 = fStack_131c;
                      fVar207 = fStack_1320;
                      fVar198 = fStack_1324;
                      fVar248 = local_1328;
                      auVar128._0_4_ = auVar127._0_4_ << 0x1f;
                      auVar128._4_4_ = auVar127._4_4_ << 0x1f;
                      auVar128._8_4_ = auVar127._8_4_ << 0x1f;
                      auVar128._12_4_ = auVar127._12_4_ << 0x1f;
                      iVar60 = movmskps((int)pRVar59,auVar128);
                      if (iVar60 == 0) {
                        *(undefined4 *)(ray + k * 4 + 0x80) = local_12a8._0_4_;
                      }
                      else {
                        local_12a8._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                        local_12a8._4_4_ = 0;
                        fStack_12a0 = 0.0;
                        fStack_129c = 0.0;
                      }
                      *(undefined4 *)(local_1338 + lVar64 * 4 + -0x10) = 0;
                      valid.field_0.i[0] =
                           -(uint)(fVar248 <= (float)local_12a8._0_4_) & valid.field_0.i[0];
                      valid.field_0.i[1] =
                           -(uint)(fVar198 <= (float)local_12a8._0_4_) & valid.field_0.i[1];
                      valid.field_0.i[2] =
                           -(uint)(fVar207 <= (float)local_12a8._0_4_) & valid.field_0.i[2];
                      valid.field_0.i[3] =
                           -(uint)(fVar215 <= (float)local_12a8._0_4_) & valid.field_0.i[3];
                      iVar60 = movmskps(iVar60,(undefined1  [16])valid.field_0);
                      if (iVar60 == 0) break;
                      auVar129._0_4_ = valid.field_0.i[0] & (uint)fVar248;
                      auVar129._4_4_ = valid.field_0.i[1] & (uint)fVar198;
                      auVar129._8_4_ = valid.field_0.i[2] & (uint)fVar207;
                      auVar129._12_4_ = valid.field_0.i[3] & (uint)fVar215;
                      auVar149._0_8_ =
                           CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) & 0x7f8000007f800000;
                      auVar149._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
                      auVar149._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
                      auVar149 = auVar149 | auVar129;
                      auVar171._4_4_ = auVar149._0_4_;
                      auVar171._0_4_ = auVar149._4_4_;
                      auVar171._8_4_ = auVar149._12_4_;
                      auVar171._12_4_ = auVar149._8_4_;
                      auVar115 = minps(auVar171,auVar149);
                      auVar130._0_8_ = auVar115._8_8_;
                      auVar130._8_4_ = auVar115._0_4_;
                      auVar130._12_4_ = auVar115._4_4_;
                      auVar115 = minps(auVar130,auVar115);
                      auVar131._0_8_ =
                           CONCAT44(-(uint)(auVar115._4_4_ == auVar149._4_4_) & valid.field_0.i[1],
                                    -(uint)(auVar115._0_4_ == auVar149._0_4_) & valid.field_0.i[0]);
                      auVar131._8_4_ =
                           -(uint)(auVar115._8_4_ == auVar149._8_4_) & valid.field_0.i[2];
                      auVar131._12_4_ =
                           -(uint)(auVar115._12_4_ == auVar149._12_4_) & valid.field_0.i[3];
                      iVar60 = movmskps(iVar60,auVar131);
                      aVar100 = valid.field_0;
                      if (iVar60 != 0) {
                        aVar100.i[2] = auVar131._8_4_;
                        aVar100._0_8_ = auVar131._0_8_;
                        aVar100.i[3] = auVar131._12_4_;
                      }
                      uVar52 = movmskps(iVar60,(undefined1  [16])aVar100);
                      uVar63 = CONCAT44((int)((ulong)pRVar59 >> 0x20),uVar52);
                      lVar64 = 0;
                      if (uVar63 != 0) {
                        for (; (uVar63 >> lVar64 & 1) == 0; lVar64 = lVar64 + 1) {
                        }
                      }
                    }
                    fStack_135c = *(float *)(ray + k * 4);
                    fStack_123c = *(float *)(ray + k * 4 + 0x10);
                    fStack_12ac = *(float *)(ray + k * 4 + 0x20);
                    local_12a8._4_4_ = *(undefined4 *)(ray + k * 4 + 0x40);
                    local_12a8._0_4_ = local_12a8._4_4_;
                    fStack_12a0 = (float)local_12a8._4_4_;
                    fStack_129c = (float)local_12a8._4_4_;
                    fStack_131c = *(float *)(ray + k * 4 + 0x50);
                    fStack_124c = *(float *)(ray + k * 4 + 0x60);
                    uVar65 = local_1158._0_4_;
                    uVar62 = 0;
                    root.ptr = local_1148;
                  }
                  auVar200._4_4_ = fStack_12ac;
                  auVar200._0_4_ = fStack_12ac;
                  auVar200._8_4_ = fStack_12ac;
                  auVar200._12_4_ = fStack_12ac;
                  fVar248 = local_1308;
                  fVar198 = fStack_1304;
                }
                fVar189 = fVar234 - fVar189;
                fVar184 = fVar236 - fVar234;
                fVar188 = fStack_1370 - fStack_1230;
                fVar196 = fStack_136c - fStack_122c;
                _local_1308 = CONCAT44(fVar184,fVar189);
                local_1318 = fVar140 - local_1318;
                fStack_1314 = fVar155 - fStack_1314;
                fStack_1310 = fVar156 - fStack_1310;
                fStack_130c = fVar157 - fStack_130c;
                fVar248 = fVar158 - fVar248;
                fVar198 = fVar174 - fVar198;
                fVar231 = fStack_1390 - fStack_1300;
                fVar232 = fStack_138c - fStack_12fc;
                fVar227 = fVar227 - fVar234;
                fVar230 = fVar230 - fVar236;
                fVar219 = fStack_1350 - fStack_1370;
                fVar220 = fStack_134c - fStack_136c;
                fVar182 = local_f98 - fVar140;
                fVar186 = fStack_f94 - fVar155;
                fVar195 = fStack_f90 - fVar156;
                fVar197 = fStack_f8c - fVar157;
                local_12f8 = local_12f8 - fVar158;
                fStack_12f4 = fStack_12f4 - fVar174;
                fStack_12f0 = fStack_12f0 - fStack_1390;
                fStack_12ec = fStack_12ec - fStack_138c;
                local_1198[0] = fVar182 * fVar248 - local_12f8 * local_1318;
                local_1198[1] = fVar186 * fVar198 - fStack_12f4 * fStack_1314;
                local_1198[2] = fVar195 * fVar231 - fStack_12f0 * fStack_1310;
                local_1198[3] = fVar197 * fVar232 - fStack_12ec * fStack_130c;
                fVar204 = local_12f8 * fVar189 - fVar227 * fVar248;
                fVar205 = fStack_12f4 * fVar184 - fVar230 * fVar198;
                fStack_1350 = fStack_12f0 * fVar188 - fVar219 * fVar231;
                fStack_134c = fStack_12ec * fVar196 - fVar220 * fVar232;
                local_1178._0_4_ = fVar227 * local_1318 - fVar182 * fVar189;
                local_1178._4_4_ = fVar230 * fStack_1314 - fVar186 * fVar184;
                local_1178._8_4_ = fVar219 * fStack_1310 - fVar195 * fVar188;
                local_1178._12_4_ = fVar220 * fStack_130c - fVar197 * fVar196;
                fVar234 = fVar234 - fStack_135c;
                fVar236 = fVar236 - fStack_135c;
                fStack_1370 = fStack_1370 - fStack_135c;
                fStack_136c = fStack_136c - fStack_135c;
                fVar140 = fVar140 - fStack_123c;
                fVar155 = fVar155 - fStack_123c;
                fVar156 = fVar156 - fStack_123c;
                fVar157 = fVar157 - fStack_123c;
                fVar158 = fVar158 - auVar200._0_4_;
                fVar174 = fVar174 - auVar200._4_4_;
                fStack_1390 = fStack_1390 - auVar200._8_4_;
                fStack_138c = fStack_138c - auVar200._12_4_;
                fVar206 = fVar140 * fStack_124c - fVar158 * fStack_131c;
                fVar212 = fVar155 * fStack_124c - fVar174 * fStack_131c;
                fVar213 = fVar156 * fStack_124c - fStack_1390 * fStack_131c;
                fVar214 = fVar157 * fStack_124c - fStack_138c * fStack_131c;
                fVar137 = fVar158 * (float)local_12a8._0_4_ - fVar234 * fStack_124c;
                fVar138 = fVar174 * (float)local_12a8._4_4_ - fVar236 * fStack_124c;
                fVar139 = fStack_1390 * fStack_12a0 - fStack_1370 * fStack_124c;
                fVar175 = fStack_138c * fStack_129c - fStack_136c * fStack_124c;
                fVar221 = fVar234 * fStack_131c - fVar140 * (float)local_12a8._0_4_;
                fVar222 = fVar236 * fStack_131c - fVar155 * (float)local_12a8._4_4_;
                fVar226 = fStack_1370 * fStack_131c - fVar156 * fStack_12a0;
                fVar229 = fStack_136c * fStack_131c - fVar157 * fStack_129c;
                local_1358 = CONCAT44(fVar205,fVar204);
                fVar207 = (float)local_12a8._0_4_ * local_1198[0] +
                          fStack_131c * fVar204 + fStack_124c * (float)local_1178._0_4_;
                fVar215 = (float)local_12a8._4_4_ * local_1198[1] +
                          fStack_131c * fVar205 + fStack_124c * (float)local_1178._4_4_;
                fVar217 = fStack_12a0 * local_1198[2] +
                          fStack_131c * fStack_1350 + fStack_124c * (float)local_1178._8_4_;
                fVar113 = fStack_129c * local_1198[3] +
                          fStack_131c * fStack_134c + fStack_124c * (float)local_1178._12_4_;
                uVar176 = (uint)fVar207 & 0x80000000;
                uVar183 = (uint)fVar215 & 0x80000000;
                uVar185 = (uint)fVar217 & 0x80000000;
                uVar187 = (uint)fVar113 & 0x80000000;
                fVar216 = (float)((uint)(fVar227 * fVar206 +
                                        fVar182 * fVar137 + local_12f8 * fVar221) ^ uVar176);
                fVar218 = (float)((uint)(fVar230 * fVar212 +
                                        fVar186 * fVar138 + fStack_12f4 * fVar222) ^ uVar183);
                fVar219 = (float)((uint)(fVar219 * fVar213 +
                                        fVar195 * fVar139 + fStack_12f0 * fVar226) ^ uVar185);
                fVar220 = (float)((uint)(fVar220 * fVar214 +
                                        fVar197 * fVar175 + fStack_12ec * fVar229) ^ uVar187);
                fVar189 = (float)((uint)(fVar206 * fVar189 +
                                        fVar137 * local_1318 + fVar221 * fVar248) ^ uVar176);
                fVar195 = (float)((uint)(fVar212 * fVar184 +
                                        fVar138 * fStack_1314 + fVar222 * fVar198) ^ uVar183);
                fVar197 = (float)((uint)(fVar213 * fVar188 +
                                        fVar139 * fStack_1310 + fVar226 * fVar231) ^ uVar185);
                fVar206 = (float)((uint)(fVar214 * fVar196 +
                                        fVar175 * fStack_130c + fVar229 * fVar232) ^ uVar187);
                fVar248 = ABS(fVar207);
                fVar227 = ABS(fVar215);
                auVar208._0_8_ = CONCAT44(fVar215,fVar207) & 0x7fffffff7fffffff;
                auVar208._8_4_ = ABS(fVar217);
                auVar208._12_4_ = ABS(fVar113);
                bVar22 = fVar216 + fVar189 <= fVar248 &&
                         ((0.0 <= fVar189 && 0.0 <= fVar216) && fVar207 != 0.0);
                auVar166._0_4_ = -(uint)bVar22;
                bVar23 = fVar218 + fVar195 <= fVar227 &&
                         ((0.0 <= fVar195 && 0.0 <= fVar218) && fVar215 != 0.0);
                auVar166._4_4_ = -(uint)bVar23;
                bVar21 = fVar219 + fVar197 <= auVar208._8_4_ &&
                         ((0.0 <= fVar197 && 0.0 <= fVar219) && fVar217 != 0.0);
                auVar166._8_4_ = -(uint)bVar21;
                bVar20 = fVar220 + fVar206 <= auVar208._12_4_ &&
                         ((0.0 <= fVar206 && 0.0 <= fVar220) && fVar113 != 0.0);
                auVar166._12_4_ = -(uint)bVar20;
                iVar51 = movmskps(uVar62,auVar166);
                uVar63 = local_10d0;
                iVar223 = local_fd8;
                iVar224 = iStack_fd4;
                iVar225 = iStack_fd0;
                iVar60 = iStack_fcc;
                fVar230 = local_10a8;
                fVar113 = fStack_10a4;
                fVar137 = fStack_10a0;
                fVar207 = fStack_109c;
                fVar138 = local_1098;
                fVar139 = fStack_1094;
                fVar175 = fStack_1090;
                fVar198 = fStack_108c;
                iVar249 = local_fa8;
                iVar252 = iStack_fa4;
                iVar255 = iStack_fa0;
                iVar258 = iStack_f9c;
                fVar182 = local_fc8;
                fVar184 = fStack_fc4;
                fVar186 = fStack_fc0;
                fVar215 = fStack_fbc;
                fStack_1300 = fVar188;
                fStack_12fc = fVar196;
                if (iVar51 != 0) {
                  fVar140 = (float)(uVar176 ^
                                   (uint)(fVar234 * local_1198[0] +
                                         fVar140 * fVar204 + fVar158 * (float)local_1178._0_4_));
                  fVar158 = (float)(uVar183 ^
                                   (uint)(fVar236 * local_1198[1] +
                                         fVar155 * fVar205 + fVar174 * (float)local_1178._4_4_));
                  fVar236 = (float)(uVar185 ^
                                   (uint)(fStack_1370 * local_1198[2] +
                                         fVar156 * fStack_1350 +
                                         fStack_1390 * (float)local_1178._8_4_));
                  fVar155 = (float)(uVar187 ^
                                   (uint)(fStack_136c * local_1198[3] +
                                         fVar157 * fStack_134c +
                                         fStack_138c * (float)local_1178._12_4_));
                  fVar217 = *(float *)(ray + k * 4 + 0x30);
                  fVar234 = *(float *)(ray + k * 4 + 0x80);
                  valid.field_0.i[0] =
                       -(uint)((fVar140 <= fVar234 * fVar248 && fVar217 * fVar248 < fVar140) &&
                              bVar22);
                  valid.field_0.i[1] =
                       -(uint)((fVar158 <= fVar234 * fVar227 && fVar217 * fVar227 < fVar158) &&
                              bVar23);
                  valid.field_0.i[2] =
                       -(uint)((fVar236 <= fVar234 * auVar208._8_4_ &&
                               fVar217 * auVar208._8_4_ < fVar236) && bVar21);
                  valid.field_0.i[3] =
                       -(uint)((fVar155 <= fVar234 * auVar208._12_4_ &&
                               fVar217 * auVar208._12_4_ < fVar155) && bVar20);
                  iVar51 = movmskps(iVar51,(undefined1  [16])valid.field_0);
                  if (iVar51 != 0) {
                    local_1188 = local_1358;
                    uStack_1180 = CONCAT44(fStack_134c,fStack_1350);
                    auVar180._0_4_ = fVar248 - fVar189;
                    auVar180._4_4_ = fVar227 - fVar195;
                    auVar180._8_4_ = auVar208._8_4_ - fVar197;
                    auVar180._12_4_ = auVar208._12_4_ - fVar206;
                    auVar169._4_12_ = auVar166._4_12_;
                    auVar169._0_4_ = (float)(int)(*(ushort *)(lVar56 + 8 + lVar69) - 1);
                    auVar201._4_4_ = auVar166._4_4_;
                    auVar201._0_4_ = auVar169._0_4_;
                    auVar201._8_4_ = auVar166._8_4_;
                    auVar201._12_4_ = auVar166._12_4_;
                    auVar115 = rcpss(auVar201,auVar169);
                    fVar217 = (2.0 - auVar169._0_4_ * auVar115._0_4_) * auVar115._0_4_;
                    auVar202._4_12_ = auVar115._4_12_;
                    auVar202._0_4_ = (float)(int)(*(ushort *)(lVar56 + 10 + lVar69) - 1);
                    auVar124._4_4_ = auVar115._4_4_;
                    auVar124._0_4_ = auVar202._0_4_;
                    auVar124._8_4_ = auVar115._8_4_;
                    auVar124._12_4_ = auVar115._12_4_;
                    auVar115 = rcpss(auVar124,auVar202);
                    fVar189 = (2.0 - auVar202._0_4_ * auVar115._0_4_) * auVar115._0_4_;
                    tNear.field_0.v[0] =
                         fVar217 * ((float)(int)local_fe8 * fVar248 + (fVar248 - fVar216));
                    tNear.field_0.v[1] =
                         fVar217 * ((float)(int)(uStack_fe4 + 1) * fVar227 + (fVar227 - fVar218));
                    tNear.field_0.v[2] =
                         fVar217 * ((float)(int)(uStack_fe0 + 1) * auVar208._8_4_ +
                                   (auVar208._8_4_ - fVar219));
                    tNear.field_0.v[3] =
                         fVar217 * ((float)(int)uStack_fdc * auVar208._12_4_ +
                                   (auVar208._12_4_ - fVar220));
                    pGVar11 = (context->scene->geometries).items[root.ptr].ptr;
                    if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      auVar115 = rcpps(auVar180,auVar208);
                      fVar217 = auVar115._0_4_;
                      fVar174 = auVar115._4_4_;
                      fVar157 = auVar115._8_4_;
                      fVar156 = auVar115._12_4_;
                      fVar217 = (1.0 - fVar248 * fVar217) * fVar217 + fVar217;
                      fVar174 = (1.0 - fVar227 * fVar174) * fVar174 + fVar174;
                      fVar157 = (1.0 - auVar208._8_4_ * fVar157) * fVar157 + fVar157;
                      fVar156 = (1.0 - auVar208._12_4_ * fVar156) * fVar156 + fVar156;
                      fVar140 = fVar140 * fVar217;
                      fVar158 = fVar158 * fVar174;
                      fVar236 = fVar236 * fVar157;
                      fVar155 = fVar155 * fVar156;
                      local_11a8[0] = fVar140;
                      local_11a8[1] = fVar158;
                      local_11a8[2] = fVar236;
                      local_11a8[3] = fVar155;
                      local_11c8[0] = tNear.field_0.v[0] * fVar217;
                      local_11c8[1] = tNear.field_0.v[1] * fVar174;
                      local_11c8[2] = tNear.field_0.v[2] * fVar157;
                      local_11c8[3] = tNear.field_0.v[3] * fVar156;
                      local_11b8[0] =
                           fVar189 * ((float)local_1138 * fVar248 + auVar180._0_4_) * fVar217;
                      local_11b8[1] =
                           fVar189 * ((float)iStack_1134 * fVar227 + auVar180._4_4_) * fVar174;
                      local_11b8[2] =
                           fVar189 * ((float)(iStack_1130 + 1) * auVar208._8_4_ + auVar180._8_4_) *
                           fVar157;
                      local_11b8[3] =
                           fVar189 * ((float)(iStack_112c + 1) * auVar208._12_4_ + auVar180._12_4_)
                           * fVar156;
                      auVar125._0_4_ = (uint)fVar140 & valid.field_0.i[0];
                      auVar125._4_4_ = (uint)fVar158 & valid.field_0.i[1];
                      auVar125._8_4_ = (uint)fVar236 & valid.field_0.i[2];
                      auVar125._12_4_ = (uint)fVar155 & valid.field_0.i[3];
                      auVar147._0_8_ =
                           CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) & 0x7f8000007f800000;
                      auVar147._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
                      auVar147._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
                      auVar147 = auVar147 | auVar125;
                      auVar170._4_4_ = auVar147._0_4_;
                      auVar170._0_4_ = auVar147._4_4_;
                      auVar170._8_4_ = auVar147._12_4_;
                      auVar170._12_4_ = auVar147._8_4_;
                      auVar115 = minps(auVar170,auVar147);
                      auVar126._0_8_ = auVar115._8_8_;
                      auVar126._8_4_ = auVar115._0_4_;
                      auVar126._12_4_ = auVar115._4_4_;
                      auVar115 = minps(auVar126,auVar115);
                      uVar187 = -(uint)(auVar115._0_4_ == auVar147._0_4_);
                      uVar75 = -(uint)(auVar115._4_4_ == auVar147._4_4_);
                      uVar76 = -(uint)(auVar115._8_4_ == auVar147._8_4_);
                      uVar78 = -(uint)(auVar115._12_4_ == auVar147._12_4_);
                      auVar148._0_4_ = uVar187 & valid.field_0.i[0];
                      auVar148._4_4_ = uVar75 & valid.field_0.i[1];
                      auVar148._8_4_ = uVar76 & valid.field_0.i[2];
                      auVar148._12_4_ = uVar78 & valid.field_0.i[3];
                      iVar51 = movmskps(*(uint *)(ray + k * 4 + 0x90),auVar148);
                      uVar62 = 0xffffffff;
                      uVar176 = 0xffffffff;
                      uVar183 = 0xffffffff;
                      uVar185 = 0xffffffff;
                      if (iVar51 != 0) {
                        uVar62 = uVar187;
                        uVar176 = uVar75;
                        uVar183 = uVar76;
                        uVar185 = uVar78;
                      }
                      auVar241._0_4_ = valid.field_0.i[0] & uVar62;
                      auVar241._4_4_ = valid.field_0.i[1] & uVar176;
                      auVar241._8_4_ = valid.field_0.i[2] & uVar183;
                      auVar241._12_4_ = valid.field_0.i[3] & uVar185;
                      uVar62 = movmskps(iVar51,auVar241);
                      lVar56 = 0;
                      if (uVar62 != 0) {
                        for (; (uVar62 >> lVar56 & 1) == 0; lVar56 = lVar56 + 1) {
                        }
                      }
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        fVar248 = local_11c8[lVar56];
                        fVar227 = local_11b8[lVar56];
                        fVar217 = local_1198[lVar56];
                        uVar52 = *(undefined4 *)((long)&local_1188 + lVar56 * 4);
                        uVar6 = *(undefined4 *)(local_1178 + lVar56 * 4);
                        *(float *)(ray + k * 4 + 0x80) = local_11a8[lVar56];
                        *(float *)(ray + k * 4 + 0xc0) = fVar217;
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar52;
                        *(undefined4 *)(ray + k * 4 + 0xe0) = uVar6;
                        *(float *)(ray + k * 4 + 0xf0) = fVar248;
                        *(float *)(ray + k * 4 + 0x100) = fVar227;
                        *(uint *)(ray + k * 4 + 0x110) = uVar65;
                        *(int *)(ray + k * 4 + 0x120) = (int)root.ptr;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        uVar6 = local_ff8._0_4_;
                        local_1378 = CONCAT44(local_ff8._0_4_,local_ff8._0_4_);
                        fStack_1370 = (float)local_ff8._0_4_;
                        fStack_136c = (float)local_ff8._0_4_;
                        uVar52 = local_10b8._0_4_;
                        local_1358 = CONCAT44(local_10b8._0_4_,local_10b8._0_4_);
                        fStack_1350 = (float)local_10b8._0_4_;
                        fStack_134c = (float)local_10b8._0_4_;
                        uVar8 = *(undefined8 *)*(undefined1 (*) [12])(mm_lookupmask_ps + lVar54);
                        local_12f8 = (float)uVar8;
                        fStack_12f4 = (float)((ulong)uVar8 >> 0x20);
                        fStack_12f0 = (float)*(undefined8 *)(mm_lookupmask_ps + lVar54 + 8);
                        fStack_12ec = (float)((ulong)*(undefined8 *)(mm_lookupmask_ps + lVar54 + 8)
                                             >> 0x20);
                        auVar211._8_4_ = 0xffffffff;
                        auVar211._0_8_ = 0xffffffffffffffff;
                        auVar211._12_4_ = 0xffffffff;
                        local_1328 = fStack_131c;
                        fStack_1324 = fStack_131c;
                        fStack_1320 = fStack_131c;
                        while( true ) {
                          local_1058 = local_11c8[lVar56];
                          fVar248 = local_11b8[lVar56];
                          *(float *)(ray + k * 4 + 0x80) = local_11a8[lVar56];
                          args.context = context->user;
                          local_1048._4_4_ = fVar248;
                          local_1048._0_4_ = fVar248;
                          fStack_1040 = fVar248;
                          fStack_103c = fVar248;
                          local_1088 = local_1198[lVar56];
                          uVar53 = *(undefined4 *)((long)&local_1188 + lVar56 * 4);
                          uVar7 = *(undefined4 *)(local_1178 + lVar56 * 4);
                          local_1078._4_4_ = uVar53;
                          local_1078._0_4_ = uVar53;
                          local_1078._8_4_ = uVar53;
                          local_1078._12_4_ = uVar53;
                          local_1068._4_4_ = uVar7;
                          local_1068._0_4_ = uVar7;
                          local_1068._8_4_ = uVar7;
                          local_1068._12_4_ = uVar7;
                          fStack_1084 = local_1088;
                          fStack_1080 = local_1088;
                          fStack_107c = local_1088;
                          fStack_1054 = local_1058;
                          fStack_1050 = local_1058;
                          fStack_104c = local_1058;
                          local_1038 = local_1358;
                          uStack_1030 = CONCAT44(uVar52,uVar52);
                          local_1028 = local_1378;
                          uStack_1020 = CONCAT44(uVar6,uVar6);
                          uStack_1014 = (args.context)->instID[0];
                          local_1018 = uStack_1014;
                          uStack_1010 = uStack_1014;
                          uStack_100c = uStack_1014;
                          uStack_1004 = (args.context)->instPrimID[0];
                          local_1008 = uStack_1004;
                          uStack_1000 = uStack_1004;
                          uStack_ffc = uStack_1004;
                          local_1338._4_4_ = fStack_12f4;
                          local_1338._0_4_ = local_12f8;
                          local_1338._8_4_ = fStack_12f0;
                          local_1338._12_4_ = fStack_12ec;
                          args.valid = (int *)local_1338;
                          args.geometryUserPtr = pGVar11->userPtr;
                          args.hit = (RTCHitN *)&local_1088;
                          args.N = 4;
                          p_Var58 = pGVar11->intersectionFilterN;
                          auVar263._8_8_ = root.ptr;
                          auVar263._0_8_ = p_Var58;
                          fStack_1390 = 0.0;
                          fStack_138c = 0.0;
                          args.ray = (RTCRayN *)ray;
                          if (p_Var58 != (RTCFilterFunctionN)0x0) {
                            auVar263 = (*p_Var58)(&args);
                            auVar211._8_4_ = 0xffffffff;
                            auVar211._0_8_ = 0xffffffffffffffff;
                            auVar211._12_4_ = 0xffffffff;
                          }
                          root.ptr = auVar263._8_8_;
                          auVar132._0_4_ = -(uint)(local_1338._0_4_ == 0);
                          auVar132._4_4_ = -(uint)(local_1338._4_4_ == 0);
                          auVar132._8_4_ = -(uint)(local_1338._8_4_ == 0);
                          auVar132._12_4_ = -(uint)(local_1338._12_4_ == 0);
                          uVar62 = movmskps(auVar263._0_4_,auVar132);
                          pRVar59 = (RTCRayN *)(ulong)(uVar62 ^ 0xf);
                          if ((uVar62 ^ 0xf) == 0) {
                            auVar132 = auVar132 ^ auVar211;
                          }
                          else {
                            p_Var58 = context->args->filter;
                            auVar49._8_8_ = root.ptr;
                            auVar49._0_8_ = p_Var58;
                            auVar264._8_8_ = root.ptr;
                            auVar264._0_8_ = p_Var58;
                            if ((p_Var58 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (auVar264 = auVar49, ((pGVar11->field_8).field_0x2 & 0x40) != 0))))
                            {
                              auVar264 = (*p_Var58)(&args);
                              auVar211._8_4_ = 0xffffffff;
                              auVar211._0_8_ = 0xffffffffffffffff;
                              auVar211._12_4_ = 0xffffffff;
                            }
                            root.ptr = auVar264._8_8_;
                            auVar101._0_4_ = -(uint)(local_1338._0_4_ == 0);
                            auVar101._4_4_ = -(uint)(local_1338._4_4_ == 0);
                            auVar101._8_4_ = -(uint)(local_1338._8_4_ == 0);
                            auVar101._12_4_ = -(uint)(local_1338._12_4_ == 0);
                            auVar132 = auVar101 ^ auVar211;
                            uVar62 = movmskps(auVar264._0_4_,auVar101);
                            pRVar59 = (RTCRayN *)(ulong)(uVar62 ^ 0xf);
                            if ((uVar62 ^ 0xf) != 0) {
                              auVar150._0_4_ = *(uint *)(args.ray + 0xc0) & auVar101._0_4_;
                              auVar150._4_4_ = *(uint *)(args.ray + 0xc4) & auVar101._4_4_;
                              auVar150._8_4_ = *(uint *)(args.ray + 200) & auVar101._8_4_;
                              auVar150._12_4_ = *(uint *)(args.ray + 0xcc) & auVar101._12_4_;
                              auVar203._0_4_ = ~auVar101._0_4_ & *(uint *)args.hit;
                              auVar203._4_4_ = ~auVar101._4_4_ & *(uint *)(args.hit + 4);
                              auVar203._8_4_ = ~auVar101._8_4_ & *(uint *)(args.hit + 8);
                              auVar203._12_4_ = ~auVar101._12_4_ & *(uint *)(args.hit + 0xc);
                              *(undefined1 (*) [16])(args.ray + 0xc0) = auVar203 | auVar150;
                              uVar62 = *(uint *)(args.hit + 0x14);
                              uVar65 = *(uint *)(args.hit + 0x18);
                              uVar176 = *(uint *)(args.hit + 0x1c);
                              *(uint *)(args.ray + 0xd0) =
                                   ~auVar101._0_4_ & *(uint *)(args.hit + 0x10) |
                                   *(uint *)(args.ray + 0xd0) & auVar101._0_4_;
                              *(uint *)(args.ray + 0xd4) =
                                   ~auVar101._4_4_ & uVar62 |
                                   *(uint *)(args.ray + 0xd4) & auVar101._4_4_;
                              *(uint *)(args.ray + 0xd8) =
                                   ~auVar101._8_4_ & uVar65 |
                                   *(uint *)(args.ray + 0xd8) & auVar101._8_4_;
                              *(uint *)(args.ray + 0xdc) =
                                   ~auVar101._12_4_ & uVar176 |
                                   *(uint *)(args.ray + 0xdc) & auVar101._12_4_;
                              auVar181._0_4_ = *(uint *)(args.ray + 0xe0) & auVar101._0_4_;
                              auVar181._4_4_ = *(uint *)(args.ray + 0xe4) & auVar101._4_4_;
                              auVar181._8_4_ = *(uint *)(args.ray + 0xe8) & auVar101._8_4_;
                              auVar181._12_4_ = *(uint *)(args.ray + 0xec) & auVar101._12_4_;
                              auVar151._0_4_ = ~auVar101._0_4_ & *(uint *)(args.hit + 0x20);
                              auVar151._4_4_ = ~auVar101._4_4_ & *(uint *)(args.hit + 0x24);
                              auVar151._8_4_ = ~auVar101._8_4_ & *(uint *)(args.hit + 0x28);
                              auVar151._12_4_ = ~auVar101._12_4_ & *(uint *)(args.hit + 0x2c);
                              *(undefined1 (*) [16])(args.ray + 0xe0) = auVar151 | auVar181;
                              auVar194._0_4_ = *(uint *)(args.ray + 0xf0) & auVar101._0_4_;
                              auVar194._4_4_ = *(uint *)(args.ray + 0xf4) & auVar101._4_4_;
                              auVar194._8_4_ = *(uint *)(args.ray + 0xf8) & auVar101._8_4_;
                              auVar194._12_4_ = *(uint *)(args.ray + 0xfc) & auVar101._12_4_;
                              auVar152._0_4_ = ~auVar101._0_4_ & *(uint *)(args.hit + 0x30);
                              auVar152._4_4_ = ~auVar101._4_4_ & *(uint *)(args.hit + 0x34);
                              auVar152._8_4_ = ~auVar101._8_4_ & *(uint *)(args.hit + 0x38);
                              auVar152._12_4_ = ~auVar101._12_4_ & *(uint *)(args.hit + 0x3c);
                              *(undefined1 (*) [16])(args.ray + 0xf0) = auVar152 | auVar194;
                              uVar62 = *(uint *)(args.hit + 0x44);
                              uVar65 = *(uint *)(args.hit + 0x48);
                              uVar176 = *(uint *)(args.hit + 0x4c);
                              *(uint *)(args.ray + 0x100) =
                                   ~auVar101._0_4_ & *(uint *)(args.hit + 0x40) |
                                   *(uint *)(args.ray + 0x100) & auVar101._0_4_;
                              *(uint *)(args.ray + 0x104) =
                                   ~auVar101._4_4_ & uVar62 |
                                   *(uint *)(args.ray + 0x104) & auVar101._4_4_;
                              *(uint *)(args.ray + 0x108) =
                                   ~auVar101._8_4_ & uVar65 |
                                   *(uint *)(args.ray + 0x108) & auVar101._8_4_;
                              *(uint *)(args.ray + 0x10c) =
                                   ~auVar101._12_4_ & uVar176 |
                                   *(uint *)(args.ray + 0x10c) & auVar101._12_4_;
                              uVar62 = *(uint *)(args.hit + 0x54);
                              uVar65 = *(uint *)(args.hit + 0x58);
                              uVar176 = *(uint *)(args.hit + 0x5c);
                              *(uint *)(args.ray + 0x110) =
                                   *(uint *)(args.ray + 0x110) & auVar101._0_4_ |
                                   ~auVar101._0_4_ & *(uint *)(args.hit + 0x50);
                              *(uint *)(args.ray + 0x114) =
                                   *(uint *)(args.ray + 0x114) & auVar101._4_4_ |
                                   ~auVar101._4_4_ & uVar62;
                              *(uint *)(args.ray + 0x118) =
                                   *(uint *)(args.ray + 0x118) & auVar101._8_4_ |
                                   ~auVar101._8_4_ & uVar65;
                              *(uint *)(args.ray + 0x11c) =
                                   *(uint *)(args.ray + 0x11c) & auVar101._12_4_ |
                                   ~auVar101._12_4_ & uVar176;
                              uVar62 = *(uint *)(args.hit + 100);
                              uVar65 = *(uint *)(args.hit + 0x68);
                              uVar176 = *(uint *)(args.hit + 0x6c);
                              *(uint *)(args.ray + 0x120) =
                                   *(uint *)(args.ray + 0x120) & auVar101._0_4_ |
                                   ~auVar101._0_4_ & *(uint *)(args.hit + 0x60);
                              *(uint *)(args.ray + 0x124) =
                                   *(uint *)(args.ray + 0x124) & auVar101._4_4_ |
                                   ~auVar101._4_4_ & uVar62;
                              *(uint *)(args.ray + 0x128) =
                                   *(uint *)(args.ray + 0x128) & auVar101._8_4_ |
                                   ~auVar101._8_4_ & uVar65;
                              *(uint *)(args.ray + 300) =
                                   *(uint *)(args.ray + 300) & auVar101._12_4_ |
                                   ~auVar101._12_4_ & uVar176;
                              auVar153._0_4_ = *(uint *)(args.ray + 0x130) & auVar101._0_4_;
                              auVar153._4_4_ = *(uint *)(args.ray + 0x134) & auVar101._4_4_;
                              auVar153._8_4_ = *(uint *)(args.ray + 0x138) & auVar101._8_4_;
                              auVar153._12_4_ = *(uint *)(args.ray + 0x13c) & auVar101._12_4_;
                              auVar172._0_4_ = ~auVar101._0_4_ & *(uint *)(args.hit + 0x70);
                              auVar172._4_4_ = ~auVar101._4_4_ & *(uint *)(args.hit + 0x74);
                              auVar172._8_4_ = ~auVar101._8_4_ & *(uint *)(args.hit + 0x78);
                              auVar172._12_4_ = ~auVar101._12_4_ & *(uint *)(args.hit + 0x7c);
                              *(undefined1 (*) [16])(args.ray + 0x130) = auVar172 | auVar153;
                              *(undefined1 (*) [16])(args.ray + 0x140) =
                                   ~auVar101 & *(undefined1 (*) [16])(args.hit + 0x80) |
                                   *(undefined1 (*) [16])(args.ray + 0x140) & auVar101;
                              pRVar59 = args.ray;
                            }
                          }
                          auVar133._0_4_ = auVar132._0_4_ << 0x1f;
                          auVar133._4_4_ = auVar132._4_4_ << 0x1f;
                          auVar133._8_4_ = auVar132._8_4_ << 0x1f;
                          auVar133._12_4_ = auVar132._12_4_ << 0x1f;
                          iVar60 = movmskps((int)pRVar59,auVar133);
                          if (iVar60 == 0) {
                            *(float *)(ray + k * 4 + 0x80) = fVar234;
                          }
                          else {
                            fVar234 = *(float *)(ray + k * 4 + 0x80);
                          }
                          *(undefined4 *)(local_1338 + lVar56 * 4 + -0x10) = 0;
                          valid.field_0.i[0] = -(uint)(fVar140 <= fVar234) & valid.field_0.i[0];
                          valid.field_0.i[1] = -(uint)(fVar158 <= fVar234) & valid.field_0.i[1];
                          valid.field_0.i[2] = -(uint)(fVar236 <= fVar234) & valid.field_0.i[2];
                          valid.field_0.i[3] = -(uint)(fVar155 <= fVar234) & valid.field_0.i[3];
                          iVar51 = movmskps(iVar60,(undefined1  [16])valid.field_0);
                          uVar63 = local_10d0;
                          iVar223 = local_fd8;
                          iVar224 = iStack_fd4;
                          iVar225 = iStack_fd0;
                          iVar60 = iStack_fcc;
                          fVar230 = local_10a8;
                          fVar113 = fStack_10a4;
                          fVar137 = fStack_10a0;
                          fVar207 = fStack_109c;
                          fVar138 = local_1098;
                          fVar139 = fStack_1094;
                          fVar175 = fStack_1090;
                          fVar198 = fStack_108c;
                          iVar249 = local_fa8;
                          iVar252 = iStack_fa4;
                          iVar255 = iStack_fa0;
                          iVar258 = iStack_f9c;
                          fVar182 = local_fc8;
                          fVar184 = fStack_fc4;
                          fVar186 = fStack_fc0;
                          fVar215 = fStack_fbc;
                          if (iVar51 == 0) break;
                          auVar134._0_4_ = valid.field_0.i[0] & (uint)fVar140;
                          auVar134._4_4_ = valid.field_0.i[1] & (uint)fVar158;
                          auVar134._8_4_ = valid.field_0.i[2] & (uint)fVar236;
                          auVar134._12_4_ = valid.field_0.i[3] & (uint)fVar155;
                          auVar154._0_8_ =
                               CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) &
                               0x7f8000007f800000;
                          auVar154._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
                          auVar154._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
                          auVar154 = auVar154 | auVar134;
                          auVar173._4_4_ = auVar154._0_4_;
                          auVar173._0_4_ = auVar154._4_4_;
                          auVar173._8_4_ = auVar154._12_4_;
                          auVar173._12_4_ = auVar154._8_4_;
                          auVar115 = minps(auVar173,auVar154);
                          auVar135._0_8_ = auVar115._8_8_;
                          auVar135._8_4_ = auVar115._0_4_;
                          auVar135._12_4_ = auVar115._4_4_;
                          auVar115 = minps(auVar135,auVar115);
                          auVar136._0_8_ =
                               CONCAT44(-(uint)(auVar115._4_4_ == auVar154._4_4_) &
                                        valid.field_0.i[1],
                                        -(uint)(auVar115._0_4_ == auVar154._0_4_) &
                                        valid.field_0.i[0]);
                          auVar136._8_4_ =
                               -(uint)(auVar115._8_4_ == auVar154._8_4_) & valid.field_0.i[2];
                          auVar136._12_4_ =
                               -(uint)(auVar115._12_4_ == auVar154._12_4_) & valid.field_0.i[3];
                          iVar60 = movmskps(iVar51,auVar136);
                          aVar102 = valid.field_0;
                          if (iVar60 != 0) {
                            aVar102.i[2] = auVar136._8_4_;
                            aVar102._0_8_ = auVar136._0_8_;
                            aVar102.i[3] = auVar136._12_4_;
                          }
                          uVar53 = movmskps(iVar60,(undefined1  [16])aVar102);
                          uVar63 = CONCAT44((int)((ulong)pRVar59 >> 0x20),uVar53);
                          lVar56 = 0;
                          if (uVar63 != 0) {
                            for (; (uVar63 >> lVar56 & 1) == 0; lVar56 = lVar56 + 1) {
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              local_10c0 = local_10c0 & local_10c0 - 1;
            } while (local_10c0 != 0);
          }
          local_10d8 = local_10d8 + 1;
        } while (local_10d8 != local_10e0);
      }
      iVar249 = *(int *)(ray + k * 4 + 0x80);
      uVar70 = local_1118;
      uVar72 = local_1120;
      uVar74 = local_1128;
      iVar252 = iVar249;
      iVar255 = iVar249;
      iVar258 = iVar249;
      fVar248 = local_1168;
      fVar227 = fStack_1164;
      fVar217 = fStack_1160;
      fVar189 = fStack_115c;
    }
    if (pSVar55 == stack) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }